

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  int iVar45;
  uint uVar46;
  uint uVar47;
  ulong uVar48;
  long lVar50;
  byte bVar51;
  uint uVar52;
  ulong uVar53;
  uint uVar54;
  ulong uVar55;
  undefined4 uVar56;
  undefined8 in_R10;
  bool bVar57;
  ulong uVar58;
  float fVar59;
  float fVar60;
  float fVar85;
  float fVar87;
  vint4 bi_2;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar86;
  float fVar88;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar89;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined8 uVar90;
  vint4 bi_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  vint4 ai_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  float fVar147;
  vint4 ai;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar148;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  vint4 bi;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  float fVar165;
  float fVar166;
  float fVar184;
  float fVar185;
  vint4 ai_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar186;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar190 [16];
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar197;
  undefined1 auVar196 [32];
  float fVar201;
  float fVar212;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar213;
  float fVar228;
  vfloat4 a0_2;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar229;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  vfloat4 a0_3;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar249;
  float fVar262;
  float fVar263;
  vfloat4 a0_1;
  undefined1 auVar253 [16];
  undefined1 auVar250 [16];
  float fVar264;
  undefined1 auVar251 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar252 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  vfloat4 a0;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar288 [32];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_700 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  undefined4 local_550;
  undefined4 local_540;
  uint auStack_520 [4];
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar49;
  undefined1 auVar287 [32];
  
  PVar3 = prim[1];
  uVar48 = (ulong)(byte)PVar3;
  fVar59 = *(float *)(prim + uVar48 * 0x19 + 0x12);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar48 * 0x19 + 6));
  auVar61._0_4_ = fVar59 * auVar8._0_4_;
  auVar61._4_4_ = fVar59 * auVar8._4_4_;
  auVar61._8_4_ = fVar59 * auVar8._8_4_;
  auVar61._12_4_ = fVar59 * auVar8._12_4_;
  auVar149._0_4_ = fVar59 * auVar9._0_4_;
  auVar149._4_4_ = fVar59 * auVar9._4_4_;
  auVar149._8_4_ = fVar59 * auVar9._8_4_;
  auVar149._12_4_ = fVar59 * auVar9._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 6 + 6)));
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xc + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xd + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x12 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x13 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x14 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar274._4_4_ = auVar149._0_4_;
  auVar274._0_4_ = auVar149._0_4_;
  auVar274._8_4_ = auVar149._0_4_;
  auVar274._12_4_ = auVar149._0_4_;
  auVar92 = vshufps_avx(auVar149,auVar149,0x55);
  auVar62 = vshufps_avx(auVar149,auVar149,0xaa);
  fVar59 = auVar62._0_4_;
  auVar230._0_4_ = fVar59 * auVar131._0_4_;
  fVar85 = auVar62._4_4_;
  auVar230._4_4_ = fVar85 * auVar131._4_4_;
  fVar87 = auVar62._8_4_;
  auVar230._8_4_ = fVar87 * auVar131._8_4_;
  fVar122 = auVar62._12_4_;
  auVar230._12_4_ = fVar122 * auVar131._12_4_;
  auVar214._0_4_ = auVar13._0_4_ * fVar59;
  auVar214._4_4_ = auVar13._4_4_ * fVar85;
  auVar214._8_4_ = auVar13._8_4_ * fVar87;
  auVar214._12_4_ = auVar13._12_4_ * fVar122;
  auVar245._0_4_ = auVar111._0_4_ * fVar59;
  auVar245._4_4_ = auVar111._4_4_ * fVar85;
  auVar245._8_4_ = auVar111._8_4_ * fVar87;
  auVar245._12_4_ = auVar111._12_4_ * fVar122;
  auVar62 = vfmadd231ps_fma(auVar230,auVar92,auVar9);
  auVar112 = vfmadd231ps_fma(auVar214,auVar92,auVar12);
  auVar92 = vfmadd231ps_fma(auVar245,auVar63,auVar92);
  auVar123 = vfmadd231ps_fma(auVar62,auVar274,auVar8);
  auVar112 = vfmadd231ps_fma(auVar112,auVar274,auVar11);
  auVar139 = vfmadd231ps_fma(auVar92,auVar64,auVar274);
  auVar275._4_4_ = auVar61._0_4_;
  auVar275._0_4_ = auVar61._0_4_;
  auVar275._8_4_ = auVar61._0_4_;
  auVar275._12_4_ = auVar61._0_4_;
  auVar92 = vshufps_avx(auVar61,auVar61,0x55);
  auVar62 = vshufps_avx(auVar61,auVar61,0xaa);
  fVar59 = auVar62._0_4_;
  auVar150._0_4_ = fVar59 * auVar131._0_4_;
  fVar85 = auVar62._4_4_;
  auVar150._4_4_ = fVar85 * auVar131._4_4_;
  fVar87 = auVar62._8_4_;
  auVar150._8_4_ = fVar87 * auVar131._8_4_;
  fVar122 = auVar62._12_4_;
  auVar150._12_4_ = fVar122 * auVar131._12_4_;
  auVar91._0_4_ = auVar13._0_4_ * fVar59;
  auVar91._4_4_ = auVar13._4_4_ * fVar85;
  auVar91._8_4_ = auVar13._8_4_ * fVar87;
  auVar91._12_4_ = auVar13._12_4_ * fVar122;
  auVar62._0_4_ = auVar111._0_4_ * fVar59;
  auVar62._4_4_ = auVar111._4_4_ * fVar85;
  auVar62._8_4_ = auVar111._8_4_ * fVar87;
  auVar62._12_4_ = auVar111._12_4_ * fVar122;
  auVar9 = vfmadd231ps_fma(auVar150,auVar92,auVar9);
  auVar131 = vfmadd231ps_fma(auVar91,auVar92,auVar12);
  auVar12 = vfmadd231ps_fma(auVar62,auVar92,auVar63);
  auVar13 = vfmadd231ps_fma(auVar9,auVar275,auVar8);
  auVar63 = vfmadd231ps_fma(auVar131,auVar275,auVar11);
  auVar111 = vfmadd231ps_fma(auVar12,auVar275,auVar64);
  auVar243._8_4_ = 0x7fffffff;
  auVar243._0_8_ = 0x7fffffff7fffffff;
  auVar243._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar123,auVar243);
  auVar253._8_4_ = 0x219392ef;
  auVar253._0_8_ = 0x219392ef219392ef;
  auVar253._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar253,1);
  auVar9 = vblendvps_avx(auVar123,auVar253,auVar8);
  auVar8 = vandps_avx(auVar112,auVar243);
  auVar8 = vcmpps_avx(auVar8,auVar253,1);
  auVar131 = vblendvps_avx(auVar112,auVar253,auVar8);
  auVar8 = vandps_avx(auVar243,auVar139);
  auVar8 = vcmpps_avx(auVar8,auVar253,1);
  auVar8 = vblendvps_avx(auVar139,auVar253,auVar8);
  auVar11 = vrcpps_avx(auVar9);
  auVar187._8_4_ = 0x3f800000;
  auVar187._0_8_ = 0x3f8000003f800000;
  auVar187._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar11,auVar187);
  auVar11 = vfmadd132ps_fma(auVar9,auVar11,auVar11);
  auVar9 = vrcpps_avx(auVar131);
  auVar131 = vfnmadd213ps_fma(auVar131,auVar9,auVar187);
  auVar12 = vfmadd132ps_fma(auVar131,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar8);
  auVar131 = vfnmadd213ps_fma(auVar8,auVar9,auVar187);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar48 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar64 = vfmadd132ps_fma(auVar131,auVar9,auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar139._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar139._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar139._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar139._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar48 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vsubps_avx(auVar8,auVar13);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar48 * 0xe + 6);
  auVar8 = vpmovsxwd_avx(auVar131);
  auVar151._0_4_ = auVar11._0_4_ * auVar9._0_4_;
  auVar151._4_4_ = auVar11._4_4_ * auVar9._4_4_;
  auVar151._8_4_ = auVar11._8_4_ * auVar9._8_4_;
  auVar151._12_4_ = auVar11._12_4_ * auVar9._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar63);
  auVar167._0_4_ = auVar12._0_4_ * auVar8._0_4_;
  auVar167._4_4_ = auVar12._4_4_ * auVar8._4_4_;
  auVar167._8_4_ = auVar12._8_4_ * auVar8._8_4_;
  auVar167._12_4_ = auVar12._12_4_ * auVar8._12_4_;
  auVar112._1_3_ = 0;
  auVar112[0] = PVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar63);
  auVar92._0_4_ = auVar12._0_4_ * auVar8._0_4_;
  auVar92._4_4_ = auVar12._4_4_ * auVar8._4_4_;
  auVar92._8_4_ = auVar12._8_4_ * auVar8._8_4_;
  auVar92._12_4_ = auVar12._12_4_ * auVar8._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar48 * 0x15 + 6);
  auVar8 = vpmovsxwd_avx(auVar12);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vsubps_avx(auVar8,auVar111);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar48 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar13);
  auVar123._0_4_ = auVar64._0_4_ * auVar9._0_4_;
  auVar123._4_4_ = auVar64._4_4_ * auVar9._4_4_;
  auVar123._8_4_ = auVar64._8_4_ * auVar9._8_4_;
  auVar123._12_4_ = auVar64._12_4_ * auVar9._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar111);
  auVar63._0_4_ = auVar64._0_4_ * auVar8._0_4_;
  auVar63._4_4_ = auVar64._4_4_ * auVar8._4_4_;
  auVar63._8_4_ = auVar64._8_4_ * auVar8._8_4_;
  auVar63._12_4_ = auVar64._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar139,auVar151);
  auVar9 = vpminsd_avx(auVar167,auVar92);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vpminsd_avx(auVar123,auVar63);
  uVar56 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar128._4_4_ = uVar56;
  auVar128._0_4_ = uVar56;
  auVar128._8_4_ = uVar56;
  auVar128._12_4_ = uVar56;
  auVar9 = vmaxps_avx(auVar9,auVar128);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  local_450._0_4_ = auVar8._0_4_ * 0.99999964;
  local_450._4_4_ = auVar8._4_4_ * 0.99999964;
  local_450._8_4_ = auVar8._8_4_ * 0.99999964;
  local_450._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar139,auVar151);
  auVar9 = vpmaxsd_avx(auVar167,auVar92);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar9 = vpmaxsd_avx(auVar123,auVar63);
  uVar56 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar111._4_4_ = uVar56;
  auVar111._0_4_ = uVar56;
  auVar111._8_4_ = uVar56;
  auVar111._12_4_ = uVar56;
  auVar9 = vminps_avx(auVar9,auVar111);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar112[4] = PVar3;
  auVar112._5_3_ = 0;
  auVar112[8] = PVar3;
  auVar112._9_3_ = 0;
  auVar112[0xc] = PVar3;
  auVar112._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar112,_DAT_01f4ad30);
  auVar64._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar64._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar64._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar64._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar8 = vcmpps_avx(local_450,auVar64,2);
  auVar8 = vandps_avx(auVar8,auVar9);
  uVar56 = vmovmskps_avx(auVar8);
  uVar48 = CONCAT44((int)((ulong)in_R10 >> 0x20),uVar56);
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  iVar45 = 1 << ((uint)k & 0x1f);
  auVar82._4_4_ = iVar45;
  auVar82._0_4_ = iVar45;
  auVar82._8_4_ = iVar45;
  auVar82._12_4_ = iVar45;
  auVar82._16_4_ = iVar45;
  auVar82._20_4_ = iVar45;
  auVar82._24_4_ = iVar45;
  auVar82._28_4_ = iVar45;
  auVar15 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar81 = vpand_avx2(auVar82,auVar15);
  local_360 = vpcmpeqd_avx2(auVar81,auVar15);
LAB_0118adab:
  if (uVar48 == 0) {
LAB_0118ca22:
    return uVar48 != 0;
  }
  lVar50 = 0;
  for (uVar53 = uVar48; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  uVar47 = *(uint *)(prim + 2);
  local_340 = *(uint *)(prim + lVar50 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar47].ptr;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_340);
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar13 = *(undefined1 (*) [16])(_Var7 + uVar53 * (long)pvVar6);
  auVar8 = *(undefined1 (*) [16])(_Var7 + (uVar53 + 1) * (long)pvVar6);
  auVar9 = *(undefined1 (*) [16])(_Var7 + (uVar53 + 2) * (long)pvVar6);
  pfVar1 = (float *)(_Var7 + (long)pvVar6 * (uVar53 + 3));
  fVar59 = *pfVar1;
  fVar85 = pfVar1[1];
  fVar87 = pfVar1[2];
  fVar122 = pfVar1[3];
  lVar50 = *(long *)&pGVar4[1].time_range.upper;
  auVar131 = *(undefined1 (*) [16])(lVar50 + (long)p_Var5 * uVar53);
  auVar11 = *(undefined1 (*) [16])(lVar50 + (long)p_Var5 * (uVar53 + 1));
  auVar12 = *(undefined1 (*) [16])(lVar50 + (long)p_Var5 * (uVar53 + 2));
  uVar58 = uVar48 - 1 & uVar48;
  pfVar1 = (float *)(lVar50 + (long)p_Var5 * (uVar53 + 3));
  fVar165 = *pfVar1;
  fVar184 = pfVar1[1];
  fVar185 = pfVar1[2];
  fVar186 = pfVar1[3];
  if (uVar58 != 0) {
    uVar55 = uVar58 - 1 & uVar58;
    for (uVar53 = uVar58; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    }
    if (uVar55 != 0) {
      for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar64 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar282._8_4_ = 0x80000000;
  auVar282._0_8_ = 0x8000000080000000;
  auVar282._12_4_ = 0x80000000;
  auVar124._0_4_ = fVar165 * -0.0;
  auVar124._4_4_ = fVar184 * -0.0;
  auVar124._8_4_ = fVar185 * -0.0;
  auVar124._12_4_ = fVar186 * -0.0;
  auVar63 = vfmadd213ps_fma((undefined1  [16])0x0,auVar12,auVar124);
  auVar65._0_4_ = auVar11._0_4_ + auVar63._0_4_;
  auVar65._4_4_ = auVar11._4_4_ + auVar63._4_4_;
  auVar65._8_4_ = auVar11._8_4_ + auVar63._8_4_;
  auVar65._12_4_ = auVar11._12_4_ + auVar63._12_4_;
  auVar111 = vfmadd231ps_fma(auVar65,auVar131,auVar282);
  auVar93._12_4_ = 0;
  auVar93._0_12_ = ZEXT812(0);
  auVar93 = auVar93 << 0x20;
  auVar113._0_4_ = fVar165 * 0.0;
  auVar113._4_4_ = fVar184 * 0.0;
  auVar113._8_4_ = fVar185 * 0.0;
  auVar113._12_4_ = fVar186 * 0.0;
  auVar202._8_4_ = 0x3f000000;
  auVar202._0_8_ = 0x3f0000003f000000;
  auVar202._12_4_ = 0x3f000000;
  auVar63 = vfmadd231ps_fma(auVar113,auVar12,auVar202);
  auVar63 = vfmadd231ps_fma(auVar63,auVar11,auVar93);
  auVar112 = vfnmadd231ps_fma(auVar63,auVar131,auVar202);
  auVar276._0_4_ = fVar59 * -0.0;
  auVar276._4_4_ = fVar85 * -0.0;
  auVar276._8_4_ = fVar87 * -0.0;
  auVar276._12_4_ = fVar122 * -0.0;
  auVar63 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar9,auVar276);
  auVar265._0_4_ = auVar8._0_4_ + auVar63._0_4_;
  auVar265._4_4_ = auVar8._4_4_ + auVar63._4_4_;
  auVar265._8_4_ = auVar8._8_4_ + auVar63._8_4_;
  auVar265._12_4_ = auVar8._12_4_ + auVar63._12_4_;
  auVar63 = vfmadd231ps_fma(auVar265,auVar13,auVar282);
  auVar250._0_4_ = fVar59 * 0.0;
  auVar250._4_4_ = fVar85 * 0.0;
  auVar250._8_4_ = fVar87 * 0.0;
  auVar250._12_4_ = fVar122 * 0.0;
  auVar92 = vfmadd231ps_fma(auVar250,auVar9,auVar202);
  auVar92 = vfmadd231ps_fma(auVar92,auVar8,auVar93);
  auVar123 = vfnmadd231ps_fma(auVar92,auVar13,auVar202);
  auVar125._0_4_ = auVar12._0_4_ + auVar124._0_4_;
  auVar125._4_4_ = auVar12._4_4_ + auVar124._4_4_;
  auVar125._8_4_ = auVar12._8_4_ + auVar124._8_4_;
  auVar125._12_4_ = auVar12._12_4_ + auVar124._12_4_;
  auVar92 = vfmadd231ps_fma(auVar125,auVar11,auVar93);
  auVar92 = vfmadd231ps_fma(auVar92,auVar131,auVar282);
  auVar140._0_4_ = fVar165 * 0.5;
  auVar140._4_4_ = fVar184 * 0.5;
  auVar140._8_4_ = fVar185 * 0.5;
  auVar140._12_4_ = fVar186 * 0.5;
  auVar12 = vfmadd231ps_fma(auVar140,auVar93,auVar12);
  auVar11 = vfnmadd231ps_fma(auVar12,auVar202,auVar11);
  auVar62 = vfmadd231ps_fma(auVar11,auVar93,auVar131);
  auVar215._0_4_ = auVar276._0_4_ + auVar9._0_4_;
  auVar215._4_4_ = auVar276._4_4_ + auVar9._4_4_;
  auVar215._8_4_ = auVar276._8_4_ + auVar9._8_4_;
  auVar215._12_4_ = auVar276._12_4_ + auVar9._12_4_;
  auVar131 = vfmadd231ps_fma(auVar215,auVar8,auVar93);
  auVar12 = vfmadd231ps_fma(auVar131,auVar13,auVar282);
  auVar231._0_4_ = fVar59 * 0.5;
  auVar231._4_4_ = fVar85 * 0.5;
  auVar231._8_4_ = fVar87 * 0.5;
  auVar231._12_4_ = fVar122 * 0.5;
  auVar9 = vfmadd231ps_fma(auVar231,auVar93,auVar9);
  auVar8 = vfnmadd231ps_fma(auVar9,auVar202,auVar8);
  auVar13 = vfmadd231ps_fma(auVar8,auVar93,auVar13);
  auVar8 = vshufps_avx(auVar112,auVar112,0xc9);
  auVar9 = vshufps_avx(auVar63,auVar63,0xc9);
  fVar86 = auVar112._0_4_;
  auVar168._0_4_ = fVar86 * auVar9._0_4_;
  fVar88 = auVar112._4_4_;
  auVar168._4_4_ = fVar88 * auVar9._4_4_;
  fVar166 = auVar112._8_4_;
  auVar168._8_4_ = fVar166 * auVar9._8_4_;
  fVar60 = auVar112._12_4_;
  auVar168._12_4_ = fVar60 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar168,auVar8,auVar63);
  auVar131 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar123,auVar123,0xc9);
  auVar169._0_4_ = fVar86 * auVar9._0_4_;
  auVar169._4_4_ = fVar88 * auVar9._4_4_;
  auVar169._8_4_ = fVar166 * auVar9._8_4_;
  auVar169._12_4_ = fVar60 * auVar9._12_4_;
  auVar8 = vfmsub231ps_fma(auVar169,auVar8,auVar123);
  auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar229 = auVar62._0_4_;
  auVar152._0_4_ = fVar229 * auVar9._0_4_;
  fVar138 = auVar62._4_4_;
  auVar152._4_4_ = fVar138 * auVar9._4_4_;
  fVar147 = auVar62._8_4_;
  auVar152._8_4_ = fVar147 * auVar9._8_4_;
  fVar148 = auVar62._12_4_;
  auVar152._12_4_ = fVar148 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar152,auVar8,auVar12);
  auVar12 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar188._0_4_ = fVar229 * auVar9._0_4_;
  auVar188._4_4_ = fVar138 * auVar9._4_4_;
  auVar188._8_4_ = fVar147 * auVar9._8_4_;
  auVar188._12_4_ = fVar148 * auVar9._12_4_;
  auVar8 = vfmsub231ps_fma(auVar188,auVar8,auVar13);
  auVar13 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vdpps_avx(auVar131,auVar131,0x7f);
  fVar85 = auVar8._0_4_;
  auVar63 = ZEXT416((uint)fVar85);
  auVar9 = vrsqrtss_avx(auVar63,auVar63);
  fVar59 = auVar9._0_4_;
  fVar59 = fVar59 * 1.5 + fVar85 * -0.5 * fVar59 * fVar59 * fVar59;
  auVar9 = vdpps_avx(auVar131,auVar11,0x7f);
  fVar165 = auVar131._0_4_ * fVar59;
  fVar184 = auVar131._4_4_ * fVar59;
  fVar185 = auVar131._8_4_ * fVar59;
  fVar186 = auVar131._12_4_ * fVar59;
  auVar244._0_4_ = auVar11._0_4_ * fVar85;
  auVar244._4_4_ = auVar11._4_4_ * fVar85;
  auVar244._8_4_ = auVar11._8_4_ * fVar85;
  auVar244._12_4_ = auVar11._12_4_ * fVar85;
  fVar85 = auVar9._0_4_;
  auVar203._0_4_ = auVar131._0_4_ * fVar85;
  auVar203._4_4_ = auVar131._4_4_ * fVar85;
  auVar203._8_4_ = auVar131._8_4_ * fVar85;
  auVar203._12_4_ = auVar131._12_4_ * fVar85;
  auVar131 = vsubps_avx(auVar244,auVar203);
  auVar9 = vrcpss_avx(auVar63,auVar63);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar87 = auVar9._0_4_ * auVar8._0_4_;
  auVar8 = vdpps_avx(auVar12,auVar12,0x7f);
  fVar122 = auVar8._0_4_;
  auVar63 = ZEXT416((uint)fVar122);
  auVar9 = vrsqrtss_avx(auVar63,auVar63);
  fVar85 = auVar9._0_4_;
  auVar9 = vdpps_avx(auVar12,auVar13,0x7f);
  fVar85 = fVar85 * 1.5 + fVar122 * -0.5 * fVar85 * fVar85 * fVar85;
  fVar249 = fVar85 * auVar12._0_4_;
  fVar262 = fVar85 * auVar12._4_4_;
  fVar263 = fVar85 * auVar12._8_4_;
  fVar264 = fVar85 * auVar12._12_4_;
  auVar189._0_4_ = fVar122 * auVar13._0_4_;
  auVar189._4_4_ = fVar122 * auVar13._4_4_;
  auVar189._8_4_ = fVar122 * auVar13._8_4_;
  auVar189._12_4_ = fVar122 * auVar13._12_4_;
  fVar122 = auVar9._0_4_;
  auVar153._0_4_ = fVar122 * auVar12._0_4_;
  auVar153._4_4_ = fVar122 * auVar12._4_4_;
  auVar153._8_4_ = fVar122 * auVar12._8_4_;
  auVar153._12_4_ = fVar122 * auVar12._12_4_;
  auVar11 = vsubps_avx(auVar189,auVar153);
  auVar9 = vrcpss_avx(auVar63,auVar63);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar122 = auVar8._0_4_ * auVar9._0_4_;
  auVar8 = vshufps_avx(auVar111,auVar111,0xff);
  auVar216._0_4_ = auVar8._0_4_ * fVar165;
  auVar216._4_4_ = auVar8._4_4_ * fVar184;
  auVar216._8_4_ = auVar8._8_4_ * fVar185;
  auVar216._12_4_ = auVar8._12_4_ * fVar186;
  auVar63 = vsubps_avx(auVar111,auVar216);
  auVar9 = vshufps_avx(auVar112,auVar112,0xff);
  auVar170._0_4_ = auVar9._0_4_ * fVar165 + fVar59 * auVar131._0_4_ * fVar87 * auVar8._0_4_;
  auVar170._4_4_ = auVar9._4_4_ * fVar184 + fVar59 * auVar131._4_4_ * fVar87 * auVar8._4_4_;
  auVar170._8_4_ = auVar9._8_4_ * fVar185 + fVar59 * auVar131._8_4_ * fVar87 * auVar8._8_4_;
  auVar170._12_4_ = auVar9._12_4_ * fVar186 + fVar59 * auVar131._12_4_ * fVar87 * auVar8._12_4_;
  auVar131 = vsubps_avx(auVar112,auVar170);
  auVar232._0_4_ = auVar216._0_4_ + auVar111._0_4_;
  auVar232._4_4_ = auVar216._4_4_ + auVar111._4_4_;
  auVar232._8_4_ = auVar216._8_4_ + auVar111._8_4_;
  auVar232._12_4_ = auVar216._12_4_ + auVar111._12_4_;
  auVar8 = vshufps_avx(auVar92,auVar92,0xff);
  auVar114._0_4_ = fVar249 * auVar8._0_4_;
  auVar114._4_4_ = fVar262 * auVar8._4_4_;
  auVar114._8_4_ = fVar263 * auVar8._8_4_;
  auVar114._12_4_ = fVar264 * auVar8._12_4_;
  auVar111 = vsubps_avx(auVar92,auVar114);
  auVar9 = vshufps_avx(auVar62,auVar62,0xff);
  auVar94._0_4_ = fVar249 * auVar9._0_4_ + auVar8._0_4_ * fVar85 * auVar11._0_4_ * fVar122;
  auVar94._4_4_ = fVar262 * auVar9._4_4_ + auVar8._4_4_ * fVar85 * auVar11._4_4_ * fVar122;
  auVar94._8_4_ = fVar263 * auVar9._8_4_ + auVar8._8_4_ * fVar85 * auVar11._8_4_ * fVar122;
  auVar94._12_4_ = fVar264 * auVar9._12_4_ + auVar8._12_4_ * fVar85 * auVar11._12_4_ * fVar122;
  auVar8 = vsubps_avx(auVar62,auVar94);
  fVar165 = auVar92._0_4_ + auVar114._0_4_;
  fVar184 = auVar92._4_4_ + auVar114._4_4_;
  fVar185 = auVar92._8_4_ + auVar114._8_4_;
  fVar186 = auVar92._12_4_ + auVar114._12_4_;
  auVar126._0_4_ = auVar63._0_4_ + auVar131._0_4_ * 0.33333334;
  auVar126._4_4_ = auVar63._4_4_ + auVar131._4_4_ * 0.33333334;
  auVar126._8_4_ = auVar63._8_4_ + auVar131._8_4_ * 0.33333334;
  auVar126._12_4_ = auVar63._12_4_ + auVar131._12_4_ * 0.33333334;
  auVar95._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar95._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar95._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar95._12_4_ = auVar8._12_4_ * 0.33333334;
  auVar92 = vsubps_avx(auVar111,auVar95);
  auVar62 = vsubps_avx(auVar63,auVar64);
  auVar8 = vshufps_avx(auVar62,auVar62,0x55);
  auVar9 = vshufps_avx(auVar62,auVar62,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar59 = pre->ray_space[k].vz.field_0.m128[0];
  fVar85 = pre->ray_space[k].vz.field_0.m128[1];
  fVar87 = pre->ray_space[k].vz.field_0.m128[2];
  fVar122 = pre->ray_space[k].vz.field_0.m128[3];
  auVar96._0_4_ = fVar59 * auVar9._0_4_;
  auVar96._4_4_ = fVar85 * auVar9._4_4_;
  auVar96._8_4_ = fVar87 * auVar9._8_4_;
  auVar96._12_4_ = fVar122 * auVar9._12_4_;
  auVar131 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar2,auVar8);
  auVar112 = vsubps_avx(auVar126,auVar64);
  auVar8 = vshufps_avx(auVar112,auVar112,0x55);
  auVar9 = vshufps_avx(auVar112,auVar112,0xaa);
  auVar283._0_4_ = fVar59 * auVar9._0_4_;
  auVar283._4_4_ = fVar85 * auVar9._4_4_;
  auVar283._8_4_ = fVar87 * auVar9._8_4_;
  auVar283._12_4_ = fVar122 * auVar9._12_4_;
  auVar9 = vfmadd231ps_fma(auVar283,(undefined1  [16])aVar2,auVar8);
  local_3e0 = vsubps_avx(auVar92,auVar64);
  auVar8 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar251._0_4_ = fVar59 * auVar8._0_4_;
  auVar251._4_4_ = fVar85 * auVar8._4_4_;
  auVar251._8_4_ = fVar87 * auVar8._8_4_;
  auVar251._12_4_ = fVar122 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar11 = vfmadd231ps_fma(auVar251,(undefined1  [16])aVar2,auVar8);
  local_3f0 = vsubps_avx(auVar111,auVar64);
  auVar8 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar266._0_4_ = fVar59 * auVar8._0_4_;
  auVar266._4_4_ = fVar85 * auVar8._4_4_;
  auVar266._8_4_ = fVar87 * auVar8._8_4_;
  auVar266._12_4_ = fVar122 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar12 = vfmadd231ps_fma(auVar266,(undefined1  [16])aVar2,auVar8);
  local_400 = vsubps_avx(auVar232,auVar64);
  auVar8 = vshufps_avx(local_400,local_400,0xaa);
  auVar154._0_4_ = fVar59 * auVar8._0_4_;
  auVar154._4_4_ = fVar85 * auVar8._4_4_;
  auVar154._8_4_ = fVar87 * auVar8._8_4_;
  auVar154._12_4_ = fVar122 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_400,local_400,0x55);
  auVar13 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar2,auVar8);
  auVar66._0_4_ = (fVar86 + auVar170._0_4_) * 0.33333334 + auVar232._0_4_;
  auVar66._4_4_ = (fVar88 + auVar170._4_4_) * 0.33333334 + auVar232._4_4_;
  auVar66._8_4_ = (fVar166 + auVar170._8_4_) * 0.33333334 + auVar232._8_4_;
  auVar66._12_4_ = (fVar60 + auVar170._12_4_) * 0.33333334 + auVar232._12_4_;
  local_410 = vsubps_avx(auVar66,auVar64);
  auVar8 = vshufps_avx(local_410,local_410,0xaa);
  auVar204._0_4_ = auVar8._0_4_ * fVar59;
  auVar204._4_4_ = auVar8._4_4_ * fVar85;
  auVar204._8_4_ = auVar8._8_4_ * fVar87;
  auVar204._12_4_ = auVar8._12_4_ * fVar122;
  auVar8 = vshufps_avx(local_410,local_410,0x55);
  auVar139 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar2,auVar8);
  auVar217._0_4_ = (fVar229 + auVar94._0_4_) * 0.33333334;
  auVar217._4_4_ = (fVar138 + auVar94._4_4_) * 0.33333334;
  auVar217._8_4_ = (fVar147 + auVar94._8_4_) * 0.33333334;
  auVar217._12_4_ = (fVar148 + auVar94._12_4_) * 0.33333334;
  auVar20._4_4_ = fVar184;
  auVar20._0_4_ = fVar165;
  auVar20._8_4_ = fVar185;
  auVar20._12_4_ = fVar186;
  auVar123 = vsubps_avx(auVar20,auVar217);
  local_420 = vsubps_avx(auVar123,auVar64);
  auVar8 = vshufps_avx(local_420,local_420,0xaa);
  auVar218._0_4_ = auVar8._0_4_ * fVar59;
  auVar218._4_4_ = auVar8._4_4_ * fVar85;
  auVar218._8_4_ = auVar8._8_4_ * fVar87;
  auVar218._12_4_ = auVar8._12_4_ * fVar122;
  auVar8 = vshufps_avx(local_420,local_420,0x55);
  auVar61 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar2,auVar8);
  local_430 = vsubps_avx(auVar20,auVar64);
  auVar8 = vshufps_avx(local_430,local_430,0xaa);
  auVar67._0_4_ = fVar59 * auVar8._0_4_;
  auVar67._4_4_ = fVar85 * auVar8._4_4_;
  auVar67._8_4_ = fVar87 * auVar8._8_4_;
  auVar67._12_4_ = fVar122 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_430,local_430,0x55);
  auVar8 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar2,auVar8);
  local_540 = auVar62._0_4_;
  auVar171._4_4_ = local_540;
  auVar171._0_4_ = local_540;
  auVar171._8_4_ = local_540;
  auVar171._12_4_ = local_540;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar64 = vfmadd231ps_fma(auVar131,(undefined1  [16])aVar2,auVar171);
  local_550 = auVar112._0_4_;
  auVar172._4_4_ = local_550;
  auVar172._0_4_ = local_550;
  auVar172._8_4_ = local_550;
  auVar172._12_4_ = local_550;
  auVar91 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar172);
  uVar56 = local_3e0._0_4_;
  auVar173._4_4_ = uVar56;
  auVar173._0_4_ = uVar56;
  auVar173._8_4_ = uVar56;
  auVar173._12_4_ = uVar56;
  auVar253 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar2,auVar173);
  uVar56 = local_3f0._0_4_;
  auVar174._4_4_ = uVar56;
  auVar174._0_4_ = uVar56;
  auVar174._8_4_ = uVar56;
  auVar174._12_4_ = uVar56;
  auVar149 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar174);
  uVar56 = local_400._0_4_;
  auVar175._4_4_ = uVar56;
  auVar175._0_4_ = uVar56;
  auVar175._8_4_ = uVar56;
  auVar175._12_4_ = uVar56;
  auVar150 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar175);
  uVar56 = local_410._0_4_;
  auVar176._4_4_ = uVar56;
  auVar176._0_4_ = uVar56;
  auVar176._8_4_ = uVar56;
  auVar176._12_4_ = uVar56;
  auVar139 = vfmadd231ps_fma(auVar139,(undefined1  [16])aVar2,auVar176);
  uVar56 = local_420._0_4_;
  auVar177._4_4_ = uVar56;
  auVar177._0_4_ = uVar56;
  auVar177._8_4_ = uVar56;
  auVar177._12_4_ = uVar56;
  auVar61 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar2,auVar177);
  uVar56 = local_430._0_4_;
  auVar178._4_4_ = uVar56;
  auVar178._0_4_ = uVar56;
  auVar178._8_4_ = uVar56;
  auVar178._12_4_ = uVar56;
  auVar151 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar2,auVar178);
  auVar11 = vmovlhps_avx(auVar64,auVar150);
  auVar12 = vmovlhps_avx(auVar91,auVar139);
  auVar13 = vmovlhps_avx(auVar253,auVar61);
  _local_3c0 = vmovlhps_avx(auVar149,auVar151);
  auVar8 = vminps_avx(auVar11,auVar12);
  auVar9 = vminps_avx(auVar13,_local_3c0);
  auVar131 = vminps_avx(auVar8,auVar9);
  auVar8 = vmaxps_avx(auVar11,auVar12);
  auVar9 = vmaxps_avx(auVar13,_local_3c0);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vshufpd_avx(auVar131,auVar131,3);
  auVar131 = vminps_avx(auVar131,auVar9);
  auVar9 = vshufpd_avx(auVar8,auVar8,3);
  auVar9 = vmaxps_avx(auVar8,auVar9);
  auVar8 = vandps_avx(auVar243,auVar131);
  auVar9 = vandps_avx(auVar243,auVar9);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vmovshdup_avx(auVar8);
  auVar8 = vmaxss_avx(auVar9,auVar8);
  local_1c0 = auVar8._0_4_ * 9.536743e-07;
  auVar190._8_8_ = auVar64._0_8_;
  auVar190._0_8_ = auVar64._0_8_;
  auVar233._8_8_ = auVar91._0_8_;
  auVar233._0_8_ = auVar91._0_8_;
  auVar252._0_8_ = auVar253._0_8_;
  auVar252._8_8_ = auVar252._0_8_;
  auVar267._0_8_ = auVar149._0_8_;
  auVar267._8_8_ = auVar267._0_8_;
  local_3d0 = ZEXT416((uint)local_1c0);
  fStack_1bc = local_1c0;
  fStack_1b8 = local_1c0;
  fStack_1b4 = local_1c0;
  fStack_1b0 = local_1c0;
  fStack_1ac = local_1c0;
  fStack_1a8 = local_1c0;
  fStack_1a4 = local_1c0;
  fStack_1d8 = -local_1c0;
  local_1e0 = -local_1c0;
  fStack_1dc = -local_1c0;
  fStack_1d4 = fStack_1d8;
  fStack_1d0 = fStack_1d8;
  fStack_1cc = fStack_1d8;
  fStack_1c8 = fStack_1d8;
  fStack_1c4 = fStack_1d8;
  local_320 = uVar47;
  uStack_31c = uVar47;
  uStack_318 = uVar47;
  uStack_314 = uVar47;
  uStack_310 = uVar47;
  uStack_30c = uVar47;
  uStack_308 = uVar47;
  uStack_304 = uVar47;
  uStack_33c = local_340;
  uStack_338 = local_340;
  uStack_334 = local_340;
  uStack_330 = local_340;
  uStack_32c = local_340;
  uStack_328 = local_340;
  uStack_324 = local_340;
  bVar57 = false;
  uVar53 = 0;
  fVar59 = *(float *)(ray + k * 4 + 0x60);
  local_390 = vsubps_avx(auVar12,auVar11);
  local_3a0 = vsubps_avx(auVar13,auVar12);
  local_3b0 = vsubps_avx(_local_3c0,auVar13);
  local_460 = vsubps_avx(auVar232,auVar63);
  local_470 = vsubps_avx(auVar66,auVar126);
  local_480 = vsubps_avx(auVar123,auVar92);
  auVar234._4_4_ = fVar184;
  auVar234._0_4_ = fVar165;
  auVar234._8_4_ = fVar185;
  auVar234._12_4_ = fVar186;
  _local_490 = vsubps_avx(auVar234,auVar111);
  auVar68 = ZEXT816(0x3f80000000000000);
  local_440 = auVar68;
LAB_0118b58d:
  auVar8 = vshufps_avx(auVar68,auVar68,0x50);
  auVar284._8_4_ = 0x3f800000;
  auVar284._0_8_ = 0x3f8000003f800000;
  auVar284._12_4_ = 0x3f800000;
  auVar287._16_4_ = 0x3f800000;
  auVar287._0_16_ = auVar284;
  auVar287._20_4_ = 0x3f800000;
  auVar287._24_4_ = 0x3f800000;
  auVar287._28_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar284,auVar8);
  fVar85 = auVar8._0_4_;
  fVar138 = auVar150._0_4_;
  auVar69._0_4_ = fVar138 * fVar85;
  fVar87 = auVar8._4_4_;
  fVar147 = auVar150._4_4_;
  auVar69._4_4_ = fVar147 * fVar87;
  fVar122 = auVar8._8_4_;
  auVar69._8_4_ = fVar138 * fVar122;
  fVar86 = auVar8._12_4_;
  auVar69._12_4_ = fVar147 * fVar86;
  fVar148 = auVar139._0_4_;
  auVar179._0_4_ = fVar148 * fVar85;
  fVar249 = auVar139._4_4_;
  auVar179._4_4_ = fVar249 * fVar87;
  auVar179._8_4_ = fVar148 * fVar122;
  auVar179._12_4_ = fVar249 * fVar86;
  fVar201 = auVar61._0_4_;
  auVar141._0_4_ = fVar201 * fVar85;
  fVar212 = auVar61._4_4_;
  auVar141._4_4_ = fVar212 * fVar87;
  auVar141._8_4_ = fVar201 * fVar122;
  auVar141._12_4_ = fVar212 * fVar86;
  fVar213 = auVar151._0_4_;
  auVar115._0_4_ = fVar213 * fVar85;
  fVar228 = auVar151._4_4_;
  auVar115._4_4_ = fVar228 * fVar87;
  auVar115._8_4_ = fVar213 * fVar122;
  auVar115._12_4_ = fVar228 * fVar86;
  auVar91 = vfmadd231ps_fma(auVar69,auVar9,auVar190);
  auVar253 = vfmadd231ps_fma(auVar179,auVar9,auVar233);
  auVar149 = vfmadd231ps_fma(auVar141,auVar9,auVar252);
  auVar167 = vfmadd231ps_fma(auVar115,auVar267,auVar9);
  auVar8 = vmovshdup_avx(local_440);
  fVar85 = local_440._0_4_;
  fStack_288 = (auVar8._0_4_ - fVar85) * 0.04761905;
  auVar226._4_4_ = fVar85;
  auVar226._0_4_ = fVar85;
  auVar226._8_4_ = fVar85;
  auVar226._12_4_ = fVar85;
  auVar226._16_4_ = fVar85;
  auVar226._20_4_ = fVar85;
  auVar226._24_4_ = fVar85;
  auVar226._28_4_ = fVar85;
  auVar106._0_8_ = auVar8._0_8_;
  auVar106._8_8_ = auVar106._0_8_;
  auVar106._16_8_ = auVar106._0_8_;
  auVar106._24_8_ = auVar106._0_8_;
  auVar81 = vsubps_avx(auVar106,auVar226);
  uVar56 = auVar91._0_4_;
  auVar280._4_4_ = uVar56;
  auVar280._0_4_ = uVar56;
  auVar280._8_4_ = uVar56;
  auVar280._12_4_ = uVar56;
  auVar280._16_4_ = uVar56;
  auVar280._20_4_ = uVar56;
  auVar280._24_4_ = uVar56;
  auVar280._28_4_ = uVar56;
  auVar8 = vmovshdup_avx(auVar91);
  uVar90 = auVar8._0_8_;
  auVar273._8_8_ = uVar90;
  auVar273._0_8_ = uVar90;
  auVar273._16_8_ = uVar90;
  auVar273._24_8_ = uVar90;
  fVar262 = auVar253._0_4_;
  auVar259._4_4_ = fVar262;
  auVar259._0_4_ = fVar262;
  auVar259._8_4_ = fVar262;
  auVar259._12_4_ = fVar262;
  auVar259._16_4_ = fVar262;
  auVar259._20_4_ = fVar262;
  auVar259._24_4_ = fVar262;
  auVar259._28_4_ = fVar262;
  auVar9 = vmovshdup_avx(auVar253);
  auVar107._0_8_ = auVar9._0_8_;
  auVar107._8_8_ = auVar107._0_8_;
  auVar107._16_8_ = auVar107._0_8_;
  auVar107._24_8_ = auVar107._0_8_;
  fVar229 = auVar149._0_4_;
  auVar194._4_4_ = fVar229;
  auVar194._0_4_ = fVar229;
  auVar194._8_4_ = fVar229;
  auVar194._12_4_ = fVar229;
  auVar194._16_4_ = fVar229;
  auVar194._20_4_ = fVar229;
  auVar194._24_4_ = fVar229;
  auVar194._28_4_ = fVar229;
  auVar131 = vmovshdup_avx(auVar149);
  auVar210._0_8_ = auVar131._0_8_;
  auVar210._8_8_ = auVar210._0_8_;
  auVar210._16_8_ = auVar210._0_8_;
  auVar210._24_8_ = auVar210._0_8_;
  fVar60 = auVar167._0_4_;
  auVar64 = vmovshdup_avx(auVar167);
  auVar245 = vfmadd132ps_fma(auVar81,auVar226,_DAT_01f7b040);
  auVar81 = vsubps_avx(auVar287,ZEXT1632(auVar245));
  fVar85 = auVar245._0_4_;
  fVar87 = auVar245._4_4_;
  auVar15._4_4_ = fVar262 * fVar87;
  auVar15._0_4_ = fVar262 * fVar85;
  fVar122 = auVar245._8_4_;
  auVar15._8_4_ = fVar262 * fVar122;
  fVar86 = auVar245._12_4_;
  auVar15._12_4_ = fVar262 * fVar86;
  auVar15._16_4_ = fVar262 * 0.0;
  auVar15._20_4_ = fVar262 * 0.0;
  auVar15._24_4_ = fVar262 * 0.0;
  auVar15._28_4_ = 0x3f800000;
  auVar245 = vfmadd231ps_fma(auVar15,auVar81,auVar280);
  fVar88 = auVar9._0_4_;
  fVar166 = auVar9._4_4_;
  auVar14._4_4_ = fVar166 * fVar87;
  auVar14._0_4_ = fVar88 * fVar85;
  auVar14._8_4_ = fVar88 * fVar122;
  auVar14._12_4_ = fVar166 * fVar86;
  auVar14._16_4_ = fVar88 * 0.0;
  auVar14._20_4_ = fVar166 * 0.0;
  auVar14._24_4_ = fVar88 * 0.0;
  auVar14._28_4_ = uVar56;
  auVar187 = vfmadd231ps_fma(auVar14,auVar81,auVar273);
  auVar10._4_4_ = fVar229 * fVar87;
  auVar10._0_4_ = fVar229 * fVar85;
  auVar10._8_4_ = fVar229 * fVar122;
  auVar10._12_4_ = fVar229 * fVar86;
  auVar10._16_4_ = fVar229 * 0.0;
  auVar10._20_4_ = fVar229 * 0.0;
  auVar10._24_4_ = fVar229 * 0.0;
  auVar10._28_4_ = auVar8._4_4_;
  auVar214 = vfmadd231ps_fma(auVar10,auVar81,auVar259);
  fVar88 = auVar131._0_4_;
  fVar166 = auVar131._4_4_;
  auVar16._4_4_ = fVar166 * fVar87;
  auVar16._0_4_ = fVar88 * fVar85;
  auVar16._8_4_ = fVar88 * fVar122;
  auVar16._12_4_ = fVar166 * fVar86;
  auVar16._16_4_ = fVar88 * 0.0;
  auVar16._20_4_ = fVar166 * 0.0;
  auVar16._24_4_ = fVar88 * 0.0;
  auVar16._28_4_ = fVar262;
  auVar128 = vfmadd231ps_fma(auVar16,auVar81,auVar107);
  auVar8 = vshufps_avx(auVar91,auVar91,0xaa);
  local_700._8_8_ = auVar8._0_8_;
  local_700._0_8_ = local_700._8_8_;
  local_700._16_8_ = local_700._8_8_;
  local_700._24_8_ = local_700._8_8_;
  auVar9 = vshufps_avx(auVar91,auVar91,0xff);
  uStack_758 = auVar9._0_8_;
  local_760 = (undefined1  [8])uStack_758;
  uStack_750 = uStack_758;
  uStack_748 = uStack_758;
  auVar17._4_4_ = fVar60 * fVar87;
  auVar17._0_4_ = fVar60 * fVar85;
  auVar17._8_4_ = fVar60 * fVar122;
  auVar17._12_4_ = fVar60 * fVar86;
  auVar17._16_4_ = fVar60 * 0.0;
  auVar17._20_4_ = fVar60 * 0.0;
  auVar17._24_4_ = fVar60 * 0.0;
  auVar17._28_4_ = fVar60;
  auVar91 = vfmadd231ps_fma(auVar17,auVar81,auVar194);
  auVar9 = vshufps_avx(auVar253,auVar253,0xaa);
  auVar195._0_8_ = auVar9._0_8_;
  auVar195._8_8_ = auVar195._0_8_;
  auVar195._16_8_ = auVar195._0_8_;
  auVar195._24_8_ = auVar195._0_8_;
  auVar131 = vshufps_avx(auVar253,auVar253,0xff);
  local_600._8_8_ = auVar131._0_8_;
  local_600._0_8_ = local_600._8_8_;
  local_600._16_8_ = local_600._8_8_;
  local_600._24_8_ = local_600._8_8_;
  fVar88 = auVar64._0_4_;
  fVar166 = auVar64._4_4_;
  auVar18._4_4_ = fVar166 * fVar87;
  auVar18._0_4_ = fVar88 * fVar85;
  auVar18._8_4_ = fVar88 * fVar122;
  auVar18._12_4_ = fVar166 * fVar86;
  auVar18._16_4_ = fVar88 * 0.0;
  auVar18._20_4_ = fVar166 * 0.0;
  auVar18._24_4_ = fVar88 * 0.0;
  auVar18._28_4_ = auVar8._4_4_;
  auVar230 = vfmadd231ps_fma(auVar18,auVar81,auVar210);
  auVar19._28_4_ = fVar166;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar214._12_4_ * fVar86,
                          CONCAT48(auVar214._8_4_ * fVar122,
                                   CONCAT44(auVar214._4_4_ * fVar87,auVar214._0_4_ * fVar85))));
  auVar245 = vfmadd231ps_fma(auVar19,auVar81,ZEXT1632(auVar245));
  fVar88 = auVar131._4_4_;
  auVar261._28_4_ = fVar88;
  auVar261._0_28_ =
       ZEXT1628(CONCAT412(auVar128._12_4_ * fVar86,
                          CONCAT48(auVar128._8_4_ * fVar122,
                                   CONCAT44(auVar128._4_4_ * fVar87,auVar128._0_4_ * fVar85))));
  auVar187 = vfmadd231ps_fma(auVar261,auVar81,ZEXT1632(auVar187));
  auVar8 = vshufps_avx(auVar149,auVar149,0xaa);
  uVar90 = auVar8._0_8_;
  auVar183._8_8_ = uVar90;
  auVar183._0_8_ = uVar90;
  auVar183._16_8_ = uVar90;
  auVar183._24_8_ = uVar90;
  auVar64 = vshufps_avx(auVar149,auVar149,0xff);
  uVar90 = auVar64._0_8_;
  auVar288._8_8_ = uVar90;
  auVar288._0_8_ = uVar90;
  auVar288._16_8_ = uVar90;
  auVar288._24_8_ = uVar90;
  auVar149 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar91._12_4_ * fVar86,
                                                CONCAT48(auVar91._8_4_ * fVar122,
                                                         CONCAT44(auVar91._4_4_ * fVar87,
                                                                  auVar91._0_4_ * fVar85)))),auVar81
                             ,ZEXT1632(auVar214));
  auVar91 = vshufps_avx(auVar167,auVar167,0xaa);
  auVar253 = vshufps_avx(auVar167,auVar167,0xff);
  auVar167 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar230._12_4_,
                                                CONCAT48(fVar122 * auVar230._8_4_,
                                                         CONCAT44(fVar87 * auVar230._4_4_,
                                                                  fVar85 * auVar230._0_4_)))),
                             auVar81,ZEXT1632(auVar128));
  auVar214 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar149._12_4_,
                                                CONCAT48(fVar122 * auVar149._8_4_,
                                                         CONCAT44(fVar87 * auVar149._4_4_,
                                                                  fVar85 * auVar149._0_4_)))),
                             auVar81,ZEXT1632(auVar245));
  auVar15 = vsubps_avx(ZEXT1632(auVar149),ZEXT1632(auVar245));
  auVar149 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar167._12_4_,
                                                CONCAT48(fVar122 * auVar167._8_4_,
                                                         CONCAT44(fVar87 * auVar167._4_4_,
                                                                  fVar85 * auVar167._0_4_)))),
                             auVar81,ZEXT1632(auVar187));
  auVar82 = vsubps_avx(ZEXT1632(auVar167),ZEXT1632(auVar187));
  fStack_5c4 = auVar82._28_4_;
  auVar260._0_4_ = fStack_288 * auVar15._0_4_ * 3.0;
  auVar260._4_4_ = fStack_288 * auVar15._4_4_ * 3.0;
  auVar260._8_4_ = fStack_288 * auVar15._8_4_ * 3.0;
  auVar260._12_4_ = fStack_288 * auVar15._12_4_ * 3.0;
  auVar260._16_4_ = fStack_288 * auVar15._16_4_ * 3.0;
  auVar260._20_4_ = fStack_288 * auVar15._20_4_ * 3.0;
  auVar260._24_4_ = fStack_288 * auVar15._24_4_ * 3.0;
  auVar260._28_4_ = 0;
  local_5e0._0_4_ = fStack_288 * auVar82._0_4_ * 3.0;
  local_5e0._4_4_ = fStack_288 * auVar82._4_4_ * 3.0;
  fStack_5d8 = fStack_288 * auVar82._8_4_ * 3.0;
  fStack_5d4 = fStack_288 * auVar82._12_4_ * 3.0;
  fStack_5d0 = fStack_288 * auVar82._16_4_ * 3.0;
  fStack_5cc = fStack_288 * auVar82._20_4_ * 3.0;
  fStack_5c8 = fStack_288 * auVar82._24_4_ * 3.0;
  fVar166 = auVar9._0_4_;
  fVar60 = auVar9._4_4_;
  auVar21._4_4_ = fVar60 * fVar87;
  auVar21._0_4_ = fVar166 * fVar85;
  auVar21._8_4_ = fVar166 * fVar122;
  auVar21._12_4_ = fVar60 * fVar86;
  auVar21._16_4_ = fVar166 * 0.0;
  auVar21._20_4_ = fVar60 * 0.0;
  auVar21._24_4_ = fVar166 * 0.0;
  auVar21._28_4_ = fStack_5c4;
  auVar9 = vfmadd231ps_fma(auVar21,auVar81,local_700);
  fVar166 = auVar131._0_4_;
  auVar22._4_4_ = fVar88 * fVar87;
  auVar22._0_4_ = fVar166 * fVar85;
  auVar22._8_4_ = fVar166 * fVar122;
  auVar22._12_4_ = fVar88 * fVar86;
  auVar22._16_4_ = fVar166 * 0.0;
  auVar22._20_4_ = fVar88 * 0.0;
  auVar22._24_4_ = fVar166 * 0.0;
  auVar22._28_4_ = 0;
  auVar131 = vfmadd231ps_fma(auVar22,auVar81,_local_760);
  fVar88 = auVar8._0_4_;
  fVar166 = auVar8._4_4_;
  auVar23._4_4_ = fVar166 * fVar87;
  auVar23._0_4_ = fVar88 * fVar85;
  auVar23._8_4_ = fVar88 * fVar122;
  auVar23._12_4_ = fVar166 * fVar86;
  auVar23._16_4_ = fVar88 * 0.0;
  auVar23._20_4_ = fVar166 * 0.0;
  auVar23._24_4_ = fVar88 * 0.0;
  auVar23._28_4_ = auVar15._28_4_;
  auVar8 = vfmadd231ps_fma(auVar23,auVar81,auVar195);
  fVar88 = auVar64._0_4_;
  fVar229 = auVar64._4_4_;
  auVar24._4_4_ = fVar229 * fVar87;
  auVar24._0_4_ = fVar88 * fVar85;
  auVar24._8_4_ = fVar88 * fVar122;
  auVar24._12_4_ = fVar229 * fVar86;
  auVar24._16_4_ = fVar88 * 0.0;
  auVar24._20_4_ = fVar229 * 0.0;
  auVar24._24_4_ = fVar88 * 0.0;
  auVar24._28_4_ = fVar60;
  auVar64 = vfmadd231ps_fma(auVar24,auVar81,local_600);
  auVar16 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar214));
  fVar88 = auVar91._0_4_;
  fVar166 = auVar91._4_4_;
  auVar25._4_4_ = fVar166 * fVar87;
  auVar25._0_4_ = fVar88 * fVar85;
  auVar25._8_4_ = fVar88 * fVar122;
  auVar25._12_4_ = fVar166 * fVar86;
  auVar25._16_4_ = fVar88 * 0.0;
  auVar25._20_4_ = fVar166 * 0.0;
  auVar25._24_4_ = fVar88 * 0.0;
  auVar25._28_4_ = fVar166;
  auVar91 = vfmadd231ps_fma(auVar25,auVar81,auVar183);
  auVar17 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar149));
  fVar88 = auVar253._0_4_;
  fVar166 = auVar253._4_4_;
  auVar26._4_4_ = fVar166 * fVar87;
  auVar26._0_4_ = fVar88 * fVar85;
  auVar26._8_4_ = fVar88 * fVar122;
  auVar26._12_4_ = fVar166 * fVar86;
  auVar26._16_4_ = fVar88 * 0.0;
  auVar26._20_4_ = fVar166 * 0.0;
  auVar26._24_4_ = fVar88 * 0.0;
  auVar26._28_4_ = fVar166;
  auVar253 = vfmadd231ps_fma(auVar26,auVar81,auVar288);
  auVar27._28_4_ = fVar229;
  auVar27._0_28_ =
       ZEXT1628(CONCAT412(auVar8._12_4_ * fVar86,
                          CONCAT48(auVar8._8_4_ * fVar122,
                                   CONCAT44(auVar8._4_4_ * fVar87,auVar8._0_4_ * fVar85))));
  auVar9 = vfmadd231ps_fma(auVar27,auVar81,ZEXT1632(auVar9));
  auVar131 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar64._12_4_,
                                                CONCAT48(fVar122 * auVar64._8_4_,
                                                         CONCAT44(fVar87 * auVar64._4_4_,
                                                                  fVar85 * auVar64._0_4_)))),auVar81
                             ,ZEXT1632(auVar131));
  auVar108._0_4_ = auVar214._0_4_ + auVar260._0_4_;
  auVar108._4_4_ = auVar214._4_4_ + auVar260._4_4_;
  auVar108._8_4_ = auVar214._8_4_ + auVar260._8_4_;
  auVar108._12_4_ = auVar214._12_4_ + auVar260._12_4_;
  auVar108._16_4_ = auVar260._16_4_ + 0.0;
  auVar108._20_4_ = auVar260._20_4_ + 0.0;
  auVar108._24_4_ = auVar260._24_4_ + 0.0;
  auVar108._28_4_ = 0;
  auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar91._12_4_ * fVar86,
                                              CONCAT48(auVar91._8_4_ * fVar122,
                                                       CONCAT44(auVar91._4_4_ * fVar87,
                                                                auVar91._0_4_ * fVar85)))),auVar81,
                           ZEXT1632(auVar8));
  auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar253._12_4_ * fVar86,
                                               CONCAT48(auVar253._8_4_ * fVar122,
                                                        CONCAT44(auVar253._4_4_ * fVar87,
                                                                 auVar253._0_4_ * fVar85)))),auVar81
                            ,ZEXT1632(auVar64));
  auVar91 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar8._12_4_,
                                               CONCAT48(fVar122 * auVar8._8_4_,
                                                        CONCAT44(fVar87 * auVar8._4_4_,
                                                                 fVar85 * auVar8._0_4_)))),auVar81,
                            ZEXT1632(auVar9));
  auVar253 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar64._12_4_ * fVar86,
                                                CONCAT48(auVar64._8_4_ * fVar122,
                                                         CONCAT44(auVar64._4_4_ * fVar87,
                                                                  auVar64._0_4_ * fVar85)))),
                             ZEXT1632(auVar131),auVar81);
  auVar81 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar15 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar131));
  auVar281._0_4_ = fStack_288 * auVar81._0_4_ * 3.0;
  auVar281._4_4_ = fStack_288 * auVar81._4_4_ * 3.0;
  auVar281._8_4_ = fStack_288 * auVar81._8_4_ * 3.0;
  auVar281._12_4_ = fStack_288 * auVar81._12_4_ * 3.0;
  auVar281._16_4_ = fStack_288 * auVar81._16_4_ * 3.0;
  auVar281._20_4_ = fStack_288 * auVar81._20_4_ * 3.0;
  auVar281._24_4_ = fStack_288 * auVar81._24_4_ * 3.0;
  auVar281._28_4_ = 0;
  local_2a0 = fStack_288 * auVar15._0_4_ * 3.0;
  fStack_29c = fStack_288 * auVar15._4_4_ * 3.0;
  auVar28._4_4_ = fStack_29c;
  auVar28._0_4_ = local_2a0;
  fStack_298 = fStack_288 * auVar15._8_4_ * 3.0;
  auVar28._8_4_ = fStack_298;
  fStack_294 = fStack_288 * auVar15._12_4_ * 3.0;
  auVar28._12_4_ = fStack_294;
  fStack_290 = fStack_288 * auVar15._16_4_ * 3.0;
  auVar28._16_4_ = fStack_290;
  fStack_28c = fStack_288 * auVar15._20_4_ * 3.0;
  auVar28._20_4_ = fStack_28c;
  fStack_288 = fStack_288 * auVar15._24_4_ * 3.0;
  auVar28._24_4_ = fStack_288;
  auVar28._28_4_ = 0x40400000;
  auVar18 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar91));
  local_4e0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar253));
  auVar81 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar214));
  auVar15 = vsubps_avx(ZEXT1632(auVar253),ZEXT1632(auVar149));
  auVar82 = vsubps_avx(auVar18,auVar16);
  fVar262 = auVar81._0_4_ + auVar82._0_4_;
  fVar263 = auVar81._4_4_ + auVar82._4_4_;
  fVar264 = auVar81._8_4_ + auVar82._8_4_;
  fVar197 = auVar81._12_4_ + auVar82._12_4_;
  fVar198 = auVar81._16_4_ + auVar82._16_4_;
  fVar199 = auVar81._20_4_ + auVar82._20_4_;
  fVar200 = auVar81._24_4_ + auVar82._24_4_;
  auVar14 = vsubps_avx(local_4e0,auVar17);
  auVar83._0_4_ = auVar15._0_4_ + auVar14._0_4_;
  auVar83._4_4_ = auVar15._4_4_ + auVar14._4_4_;
  auVar83._8_4_ = auVar15._8_4_ + auVar14._8_4_;
  auVar83._12_4_ = auVar15._12_4_ + auVar14._12_4_;
  auVar83._16_4_ = auVar15._16_4_ + auVar14._16_4_;
  auVar83._20_4_ = auVar15._20_4_ + auVar14._20_4_;
  auVar83._24_4_ = auVar15._24_4_ + auVar14._24_4_;
  auVar83._28_4_ = auVar15._28_4_ + auVar14._28_4_;
  local_240 = ZEXT1632(auVar149);
  fVar85 = auVar149._0_4_;
  local_2c0 = (float)local_5e0._0_4_ + fVar85;
  fVar87 = auVar149._4_4_;
  fStack_2bc = (float)local_5e0._4_4_ + fVar87;
  fVar122 = auVar149._8_4_;
  fStack_2b8 = fStack_5d8 + fVar122;
  fVar86 = auVar149._12_4_;
  fStack_2b4 = fStack_5d4 + fVar86;
  fStack_2b0 = fStack_5d0 + 0.0;
  fStack_2ac = fStack_5cc + 0.0;
  fStack_2a8 = fStack_5c8 + 0.0;
  local_200 = ZEXT1632(auVar214);
  auVar15 = vsubps_avx(local_200,auVar260);
  local_220 = vpermps_avx2(_DAT_01fb7720,auVar15);
  auVar15 = vsubps_avx(local_240,_local_5e0);
  local_2e0 = vpermps_avx2(_DAT_01fb7720,auVar15);
  local_260._0_4_ = auVar91._0_4_ + auVar281._0_4_;
  local_260._4_4_ = auVar91._4_4_ + auVar281._4_4_;
  local_260._8_4_ = auVar91._8_4_ + auVar281._8_4_;
  local_260._12_4_ = auVar91._12_4_ + auVar281._12_4_;
  local_260._16_4_ = auVar281._16_4_ + 0.0;
  local_260._20_4_ = auVar281._20_4_ + 0.0;
  local_260._24_4_ = auVar281._24_4_ + 0.0;
  local_260._28_4_ = 0;
  auVar261 = ZEXT1632(auVar91);
  auVar15 = vsubps_avx(auVar261,auVar281);
  auVar19 = vpermps_avx2(_DAT_01fb7720,auVar15);
  fVar88 = auVar253._0_4_;
  local_2a0 = fVar88 + local_2a0;
  fVar166 = auVar253._4_4_;
  fStack_29c = fVar166 + fStack_29c;
  fVar60 = auVar253._8_4_;
  fStack_298 = fVar60 + fStack_298;
  fVar229 = auVar253._12_4_;
  fStack_294 = fVar229 + fStack_294;
  fStack_290 = fStack_290 + 0.0;
  fStack_28c = fStack_28c + 0.0;
  fStack_288 = fStack_288 + 0.0;
  auVar15 = vsubps_avx(ZEXT1632(auVar253),auVar28);
  local_280 = vpermps_avx2(_DAT_01fb7720,auVar15);
  auVar29._4_4_ = fVar87 * fVar263;
  auVar29._0_4_ = fVar85 * fVar262;
  auVar29._8_4_ = fVar122 * fVar264;
  auVar29._12_4_ = fVar86 * fVar197;
  auVar29._16_4_ = fVar198 * 0.0;
  auVar29._20_4_ = fVar199 * 0.0;
  auVar29._24_4_ = fVar200 * 0.0;
  auVar29._28_4_ = auVar15._28_4_;
  auVar8 = vfnmadd231ps_fma(auVar29,local_200,auVar83);
  fStack_2a4 = fStack_5c4 + 0.0;
  auVar30._4_4_ = fStack_2bc * fVar263;
  auVar30._0_4_ = local_2c0 * fVar262;
  auVar30._8_4_ = fStack_2b8 * fVar264;
  auVar30._12_4_ = fStack_2b4 * fVar197;
  auVar30._16_4_ = fStack_2b0 * fVar198;
  auVar30._20_4_ = fStack_2ac * fVar199;
  auVar30._24_4_ = fStack_2a8 * fVar200;
  auVar30._28_4_ = 0;
  auVar9 = vfnmadd231ps_fma(auVar30,auVar83,auVar108);
  auVar31._4_4_ = local_2e0._4_4_ * fVar263;
  auVar31._0_4_ = local_2e0._0_4_ * fVar262;
  auVar31._8_4_ = local_2e0._8_4_ * fVar264;
  auVar31._12_4_ = local_2e0._12_4_ * fVar197;
  auVar31._16_4_ = local_2e0._16_4_ * fVar198;
  auVar31._20_4_ = local_2e0._20_4_ * fVar199;
  auVar31._24_4_ = local_2e0._24_4_ * fVar200;
  auVar31._28_4_ = fStack_5c4 + 0.0;
  auVar131 = vfnmadd231ps_fma(auVar31,local_220,auVar83);
  local_760._0_4_ = auVar17._0_4_;
  local_760._4_4_ = auVar17._4_4_;
  uStack_758._0_4_ = auVar17._8_4_;
  uStack_758._4_4_ = auVar17._12_4_;
  uStack_750._0_4_ = auVar17._16_4_;
  uStack_750._4_4_ = auVar17._20_4_;
  uStack_748._0_4_ = auVar17._24_4_;
  uStack_748._4_4_ = auVar17._28_4_;
  auVar32._4_4_ = (float)local_760._4_4_ * fVar263;
  auVar32._0_4_ = (float)local_760._0_4_ * fVar262;
  auVar32._8_4_ = (float)uStack_758 * fVar264;
  auVar32._12_4_ = uStack_758._4_4_ * fVar197;
  auVar32._16_4_ = (float)uStack_750 * fVar198;
  auVar32._20_4_ = uStack_750._4_4_ * fVar199;
  auVar32._24_4_ = (float)uStack_748 * fVar200;
  auVar32._28_4_ = uStack_748._4_4_;
  auVar64 = vfnmadd231ps_fma(auVar32,auVar16,auVar83);
  auVar211._0_4_ = fVar88 * fVar262;
  auVar211._4_4_ = fVar166 * fVar263;
  auVar211._8_4_ = fVar60 * fVar264;
  auVar211._12_4_ = fVar229 * fVar197;
  auVar211._16_4_ = fVar198 * 0.0;
  auVar211._20_4_ = fVar199 * 0.0;
  auVar211._24_4_ = fVar200 * 0.0;
  auVar211._28_4_ = 0;
  auVar91 = vfnmadd231ps_fma(auVar211,auVar261,auVar83);
  uStack_284 = 0x40400000;
  auVar33._4_4_ = fStack_29c * fVar263;
  auVar33._0_4_ = local_2a0 * fVar262;
  auVar33._8_4_ = fStack_298 * fVar264;
  auVar33._12_4_ = fStack_294 * fVar197;
  auVar33._16_4_ = fStack_290 * fVar198;
  auVar33._20_4_ = fStack_28c * fVar199;
  auVar33._24_4_ = fStack_288 * fVar200;
  auVar33._28_4_ = auVar16._28_4_;
  auVar149 = vfnmadd231ps_fma(auVar33,local_260,auVar83);
  auVar34._4_4_ = local_280._4_4_ * fVar263;
  auVar34._0_4_ = local_280._0_4_ * fVar262;
  auVar34._8_4_ = local_280._8_4_ * fVar264;
  auVar34._12_4_ = local_280._12_4_ * fVar197;
  auVar34._16_4_ = local_280._16_4_ * fVar198;
  auVar34._20_4_ = local_280._20_4_ * fVar199;
  auVar34._24_4_ = local_280._24_4_ * fVar200;
  auVar34._28_4_ = local_280._28_4_;
  auVar167 = vfnmadd231ps_fma(auVar34,auVar19,auVar83);
  auVar35._4_4_ = local_4e0._4_4_ * fVar263;
  auVar35._0_4_ = local_4e0._0_4_ * fVar262;
  auVar35._8_4_ = local_4e0._8_4_ * fVar264;
  auVar35._12_4_ = local_4e0._12_4_ * fVar197;
  auVar35._16_4_ = local_4e0._16_4_ * fVar198;
  auVar35._20_4_ = local_4e0._20_4_ * fVar199;
  auVar35._24_4_ = local_4e0._24_4_ * fVar200;
  auVar35._28_4_ = auVar81._28_4_ + auVar82._28_4_;
  auVar227 = ZEXT3264(auVar18);
  auVar245 = vfnmadd231ps_fma(auVar35,auVar18,auVar83);
  auVar15 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar81 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar82 = vminps_avx(ZEXT1632(auVar131),ZEXT1632(auVar64));
  auVar82 = vminps_avx(auVar15,auVar82);
  auVar15 = vmaxps_avx(ZEXT1632(auVar131),ZEXT1632(auVar64));
  auVar81 = vmaxps_avx(auVar81,auVar15);
  auVar14 = vminps_avx(ZEXT1632(auVar91),ZEXT1632(auVar149));
  auVar15 = vmaxps_avx(ZEXT1632(auVar91),ZEXT1632(auVar149));
  auVar10 = vminps_avx(ZEXT1632(auVar167),ZEXT1632(auVar245));
  auVar14 = vminps_avx(auVar14,auVar10);
  auVar14 = vminps_avx(auVar82,auVar14);
  auVar82 = vmaxps_avx(ZEXT1632(auVar167),ZEXT1632(auVar245));
  auVar15 = vmaxps_avx(auVar15,auVar82);
  auVar15 = vmaxps_avx(auVar81,auVar15);
  auVar44._4_4_ = fStack_1bc;
  auVar44._0_4_ = local_1c0;
  auVar44._8_4_ = fStack_1b8;
  auVar44._12_4_ = fStack_1b4;
  auVar44._16_4_ = fStack_1b0;
  auVar44._20_4_ = fStack_1ac;
  auVar44._24_4_ = fStack_1a8;
  auVar44._28_4_ = fStack_1a4;
  auVar81 = vcmpps_avx(auVar14,auVar44,2);
  auVar43._4_4_ = fStack_1dc;
  auVar43._0_4_ = local_1e0;
  auVar43._8_4_ = fStack_1d8;
  auVar43._12_4_ = fStack_1d4;
  auVar43._16_4_ = fStack_1d0;
  auVar43._20_4_ = fStack_1cc;
  auVar43._24_4_ = fStack_1c8;
  auVar43._28_4_ = fStack_1c4;
  auVar15 = vcmpps_avx(auVar15,auVar43,5);
  auVar81 = vandps_avx(auVar15,auVar81);
  auVar15 = local_300 & auVar81;
  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0x7f,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar15 >> 0xbf,0) != '\0') ||
      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
    auVar15 = vsubps_avx(auVar16,local_200);
    auVar82 = vsubps_avx(auVar18,auVar261);
    fVar263 = auVar15._0_4_ + auVar82._0_4_;
    fVar264 = auVar15._4_4_ + auVar82._4_4_;
    fVar197 = auVar15._8_4_ + auVar82._8_4_;
    fVar198 = auVar15._12_4_ + auVar82._12_4_;
    fVar199 = auVar15._16_4_ + auVar82._16_4_;
    fVar200 = auVar15._20_4_ + auVar82._20_4_;
    fVar89 = auVar15._24_4_ + auVar82._24_4_;
    auVar14 = vsubps_avx(auVar17,local_240);
    auVar10 = vsubps_avx(local_4e0,ZEXT1632(auVar253));
    auVar109._0_4_ = auVar14._0_4_ + auVar10._0_4_;
    auVar109._4_4_ = auVar14._4_4_ + auVar10._4_4_;
    auVar109._8_4_ = auVar14._8_4_ + auVar10._8_4_;
    auVar109._12_4_ = auVar14._12_4_ + auVar10._12_4_;
    auVar109._16_4_ = auVar14._16_4_ + auVar10._16_4_;
    auVar109._20_4_ = auVar14._20_4_ + auVar10._20_4_;
    auVar109._24_4_ = auVar14._24_4_ + auVar10._24_4_;
    fVar262 = auVar10._28_4_;
    auVar109._28_4_ = auVar14._28_4_ + fVar262;
    auVar36._4_4_ = fVar87 * fVar264;
    auVar36._0_4_ = fVar85 * fVar263;
    auVar36._8_4_ = fVar122 * fVar197;
    auVar36._12_4_ = fVar86 * fVar198;
    auVar36._16_4_ = fVar199 * 0.0;
    auVar36._20_4_ = fVar200 * 0.0;
    auVar36._24_4_ = fVar89 * 0.0;
    auVar36._28_4_ = local_4e0._28_4_;
    auVar91 = vfnmadd231ps_fma(auVar36,auVar109,local_200);
    auVar37._4_4_ = fVar264 * fStack_2bc;
    auVar37._0_4_ = fVar263 * local_2c0;
    auVar37._8_4_ = fVar197 * fStack_2b8;
    auVar37._12_4_ = fVar198 * fStack_2b4;
    auVar37._16_4_ = fVar199 * fStack_2b0;
    auVar37._20_4_ = fVar200 * fStack_2ac;
    auVar37._24_4_ = fVar89 * fStack_2a8;
    auVar37._28_4_ = 0;
    auVar8 = vfnmadd213ps_fma(auVar108,auVar109,auVar37);
    auVar38._4_4_ = fVar264 * local_2e0._4_4_;
    auVar38._0_4_ = fVar263 * local_2e0._0_4_;
    auVar38._8_4_ = fVar197 * local_2e0._8_4_;
    auVar38._12_4_ = fVar198 * local_2e0._12_4_;
    auVar38._16_4_ = fVar199 * local_2e0._16_4_;
    auVar38._20_4_ = fVar200 * local_2e0._20_4_;
    auVar38._24_4_ = fVar89 * local_2e0._24_4_;
    auVar38._28_4_ = 0;
    auVar9 = vfnmadd213ps_fma(local_220,auVar109,auVar38);
    auVar39._4_4_ = (float)local_760._4_4_ * fVar264;
    auVar39._0_4_ = (float)local_760._0_4_ * fVar263;
    auVar39._8_4_ = (float)uStack_758 * fVar197;
    auVar39._12_4_ = uStack_758._4_4_ * fVar198;
    auVar39._16_4_ = (float)uStack_750 * fVar199;
    auVar39._20_4_ = uStack_750._4_4_ * fVar200;
    auVar39._24_4_ = (float)uStack_748 * fVar89;
    auVar39._28_4_ = 0;
    auVar253 = vfnmadd231ps_fma(auVar39,auVar109,auVar16);
    auVar136._0_4_ = fVar88 * fVar263;
    auVar136._4_4_ = fVar166 * fVar264;
    auVar136._8_4_ = fVar60 * fVar197;
    auVar136._12_4_ = fVar229 * fVar198;
    auVar136._16_4_ = fVar199 * 0.0;
    auVar136._20_4_ = fVar200 * 0.0;
    auVar136._24_4_ = fVar89 * 0.0;
    auVar136._28_4_ = 0;
    auVar149 = vfnmadd231ps_fma(auVar136,auVar109,auVar261);
    auVar40._4_4_ = fVar264 * fStack_29c;
    auVar40._0_4_ = fVar263 * local_2a0;
    auVar40._8_4_ = fVar197 * fStack_298;
    auVar40._12_4_ = fVar198 * fStack_294;
    auVar40._16_4_ = fVar199 * fStack_290;
    auVar40._20_4_ = fVar200 * fStack_28c;
    auVar40._24_4_ = fVar89 * fStack_288;
    auVar40._28_4_ = fVar262;
    auVar131 = vfnmadd213ps_fma(local_260,auVar109,auVar40);
    auVar41._4_4_ = fVar264 * local_280._4_4_;
    auVar41._0_4_ = fVar263 * local_280._0_4_;
    auVar41._8_4_ = fVar197 * local_280._8_4_;
    auVar41._12_4_ = fVar198 * local_280._12_4_;
    auVar41._16_4_ = fVar199 * local_280._16_4_;
    auVar41._20_4_ = fVar200 * local_280._20_4_;
    auVar41._24_4_ = fVar89 * local_280._24_4_;
    auVar41._28_4_ = fVar262;
    auVar64 = vfnmadd213ps_fma(auVar19,auVar109,auVar41);
    auVar227 = ZEXT1664(auVar64);
    auVar42._4_4_ = fVar264 * local_4e0._4_4_;
    auVar42._0_4_ = fVar263 * local_4e0._0_4_;
    auVar42._8_4_ = fVar197 * local_4e0._8_4_;
    auVar42._12_4_ = fVar198 * local_4e0._12_4_;
    auVar42._16_4_ = fVar199 * local_4e0._16_4_;
    auVar42._20_4_ = fVar200 * local_4e0._20_4_;
    auVar42._24_4_ = fVar89 * local_4e0._24_4_;
    auVar42._28_4_ = auVar15._28_4_ + auVar82._28_4_;
    auVar167 = vfnmadd231ps_fma(auVar42,auVar109,auVar18);
    auVar82 = vminps_avx(ZEXT1632(auVar91),ZEXT1632(auVar8));
    auVar15 = vmaxps_avx(ZEXT1632(auVar91),ZEXT1632(auVar8));
    auVar14 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar253));
    auVar14 = vminps_avx(auVar82,auVar14);
    auVar82 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar253));
    auVar15 = vmaxps_avx(auVar15,auVar82);
    auVar10 = vminps_avx(ZEXT1632(auVar149),ZEXT1632(auVar131));
    auVar82 = vmaxps_avx(ZEXT1632(auVar149),ZEXT1632(auVar131));
    auVar16 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar167));
    auVar10 = vminps_avx(auVar10,auVar16);
    auVar10 = vminps_avx(auVar14,auVar10);
    auVar14 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar167));
    auVar82 = vmaxps_avx(auVar82,auVar14);
    auVar82 = vmaxps_avx(auVar15,auVar82);
    auVar15 = vcmpps_avx(auVar10,auVar44,2);
    auVar82 = vcmpps_avx(auVar82,auVar43,5);
    auVar15 = vandps_avx(auVar82,auVar15);
    auVar81 = vandps_avx(auVar81,local_300);
    auVar82 = auVar81 & auVar15;
    if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar82 >> 0x7f,0) != '\0') ||
          (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar82 >> 0xbf,0) != '\0') ||
        (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar82[0x1f] < '\0')
    {
      auVar81 = vandps_avx(auVar15,auVar81);
      uVar54 = vmovmskps_avx(auVar81);
      if (uVar54 != 0) {
        auStack_520[uVar53] = uVar54 & 0xff;
        uVar90 = vmovlps_avx(local_440);
        *(undefined8 *)(&uStack_380 + uVar53 * 2) = uVar90;
        uVar55 = vmovlps_avx(auVar68);
        auStack_1a0[uVar53] = uVar55;
        uVar53 = (ulong)((int)uVar53 + 1);
      }
    }
  }
LAB_0118bb3d:
  if ((int)uVar53 != 0) {
    uVar46 = (int)uVar53 - 1;
    uVar49 = (ulong)uVar46;
    uVar52 = auStack_520[uVar49];
    uVar54 = (&uStack_380)[uVar49 * 2];
    fVar85 = afStack_37c[uVar49 * 2];
    iVar45 = 0;
    for (uVar55 = (ulong)uVar52; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      iVar45 = iVar45 + 1;
    }
    uVar52 = uVar52 - 1 & uVar52;
    if (uVar52 == 0) {
      uVar53 = (ulong)uVar46;
    }
    auVar68._8_8_ = 0;
    auVar68._0_8_ = auStack_1a0[uVar49];
    auStack_520[uVar49] = uVar52;
    fVar87 = (float)(iVar45 + 1) * 0.14285715;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar85 * (float)iVar45 * 0.14285715)),ZEXT416(uVar54),
                             ZEXT416((uint)(1.0 - (float)iVar45 * 0.14285715)));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar85 * fVar87)),ZEXT416(uVar54),
                             ZEXT416((uint)(1.0 - fVar87)));
    fVar87 = auVar9._0_4_;
    auVar196._0_4_ = auVar8._0_4_;
    fVar85 = fVar87 - auVar196._0_4_;
    if (fVar85 < 0.16666667) {
      auVar131 = vshufps_avx(auVar68,auVar68,0x50);
      auVar97._8_4_ = 0x3f800000;
      auVar97._0_8_ = 0x3f8000003f800000;
      auVar97._12_4_ = 0x3f800000;
      auVar64 = vsubps_avx(auVar97,auVar131);
      fVar122 = auVar131._0_4_;
      auVar142._0_4_ = fVar122 * fVar138;
      fVar86 = auVar131._4_4_;
      auVar142._4_4_ = fVar86 * fVar147;
      fVar88 = auVar131._8_4_;
      auVar142._8_4_ = fVar88 * fVar138;
      fVar166 = auVar131._12_4_;
      auVar142._12_4_ = fVar166 * fVar147;
      auVar155._0_4_ = fVar122 * fVar148;
      auVar155._4_4_ = fVar86 * fVar249;
      auVar155._8_4_ = fVar88 * fVar148;
      auVar155._12_4_ = fVar166 * fVar249;
      auVar180._0_4_ = fVar122 * fVar201;
      auVar180._4_4_ = fVar86 * fVar212;
      auVar180._8_4_ = fVar88 * fVar201;
      auVar180._12_4_ = fVar166 * fVar212;
      auVar70._0_4_ = fVar122 * fVar213;
      auVar70._4_4_ = fVar86 * fVar228;
      auVar70._8_4_ = fVar88 * fVar213;
      auVar70._12_4_ = fVar166 * fVar228;
      auVar131 = vfmadd231ps_fma(auVar142,auVar64,auVar190);
      auVar91 = vfmadd231ps_fma(auVar155,auVar64,auVar233);
      auVar253 = vfmadd231ps_fma(auVar180,auVar64,auVar252);
      auVar64 = vfmadd231ps_fma(auVar70,auVar64,auVar267);
      auVar137._16_16_ = auVar131;
      auVar137._0_16_ = auVar131;
      auVar146._16_16_ = auVar91;
      auVar146._0_16_ = auVar91;
      auVar164._16_16_ = auVar253;
      auVar164._0_16_ = auVar253;
      auVar196._4_4_ = auVar196._0_4_;
      auVar196._8_4_ = auVar196._0_4_;
      auVar196._12_4_ = auVar196._0_4_;
      auVar196._20_4_ = fVar87;
      auVar196._16_4_ = fVar87;
      auVar196._24_4_ = fVar87;
      auVar196._28_4_ = fVar87;
      auVar81 = vsubps_avx(auVar146,auVar137);
      auVar91 = vfmadd213ps_fma(auVar81,auVar196,auVar137);
      auVar81 = vsubps_avx(auVar164,auVar146);
      auVar149 = vfmadd213ps_fma(auVar81,auVar196,auVar146);
      auVar131 = vsubps_avx(auVar64,auVar253);
      auVar84._16_16_ = auVar131;
      auVar84._0_16_ = auVar131;
      auVar131 = vfmadd213ps_fma(auVar84,auVar196,auVar164);
      auVar81 = vsubps_avx(ZEXT1632(auVar149),ZEXT1632(auVar91));
      auVar64 = vfmadd213ps_fma(auVar81,auVar196,ZEXT1632(auVar91));
      auVar81 = vsubps_avx(ZEXT1632(auVar131),ZEXT1632(auVar149));
      auVar131 = vfmadd213ps_fma(auVar81,auVar196,ZEXT1632(auVar149));
      auVar81 = vsubps_avx(ZEXT1632(auVar131),ZEXT1632(auVar64));
      auVar187 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar81,auVar196);
      fVar229 = auVar81._4_4_ * 3.0;
      fVar122 = fVar85 * 0.33333334;
      local_4e0._0_8_ =
           CONCAT44(auVar187._4_4_ + fVar122 * fVar229,
                    auVar187._0_4_ + fVar122 * auVar81._0_4_ * 3.0);
      local_4e0._8_4_ = auVar187._8_4_ + fVar122 * auVar81._8_4_ * 3.0;
      local_4e0._12_4_ = auVar187._12_4_ + fVar122 * auVar81._12_4_ * 3.0;
      auVar64 = vshufpd_avx(auVar187,auVar187,3);
      auVar91 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar131 = vsubps_avx(auVar64,auVar187);
      auVar253 = vsubps_avx(auVar91,(undefined1  [16])0x0);
      auVar71._0_4_ = auVar131._0_4_ + auVar253._0_4_;
      auVar71._4_4_ = auVar131._4_4_ + auVar253._4_4_;
      auVar71._8_4_ = auVar131._8_4_ + auVar253._8_4_;
      auVar71._12_4_ = auVar131._12_4_ + auVar253._12_4_;
      auVar131 = vshufps_avx(auVar187,auVar187,0xb1);
      auVar253 = vshufps_avx(local_4e0._0_16_,local_4e0._0_16_,0xb1);
      auVar277._4_4_ = auVar71._0_4_;
      auVar277._0_4_ = auVar71._0_4_;
      auVar277._8_4_ = auVar71._0_4_;
      auVar277._12_4_ = auVar71._0_4_;
      auVar149 = vshufps_avx(auVar71,auVar71,0x55);
      fVar86 = auVar149._0_4_;
      auVar72._0_4_ = fVar86 * auVar131._0_4_;
      fVar88 = auVar149._4_4_;
      auVar72._4_4_ = fVar88 * auVar131._4_4_;
      fVar166 = auVar149._8_4_;
      auVar72._8_4_ = fVar166 * auVar131._8_4_;
      fVar60 = auVar149._12_4_;
      auVar72._12_4_ = fVar60 * auVar131._12_4_;
      auVar156._0_4_ = fVar86 * auVar253._0_4_;
      auVar156._4_4_ = fVar88 * auVar253._4_4_;
      auVar156._8_4_ = fVar166 * auVar253._8_4_;
      auVar156._12_4_ = fVar60 * auVar253._12_4_;
      auVar167 = vfmadd231ps_fma(auVar72,auVar277,auVar187);
      auVar245 = vfmadd231ps_fma(auVar156,auVar277,local_4e0._0_16_);
      auVar253 = vshufps_avx(auVar167,auVar167,0xe8);
      auVar149 = vshufps_avx(auVar245,auVar245,0xe8);
      auVar131 = vcmpps_avx(auVar253,auVar149,1);
      uVar54 = vextractps_avx(auVar131,0);
      auVar214 = auVar245;
      if ((uVar54 & 1) == 0) {
        auVar214 = auVar167;
      }
      auVar127._0_4_ = fVar122 * auVar81._16_4_ * 3.0;
      auVar127._4_4_ = fVar122 * fVar229;
      auVar127._8_4_ = fVar122 * auVar81._24_4_ * 3.0;
      auVar127._12_4_ = fVar122 * auVar227._28_4_;
      auVar275 = vsubps_avx((undefined1  [16])0x0,auVar127);
      auVar128 = vshufps_avx(auVar275,auVar275,0xb1);
      auVar230 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar191._0_4_ = fVar86 * auVar128._0_4_;
      auVar191._4_4_ = fVar88 * auVar128._4_4_;
      auVar191._8_4_ = fVar166 * auVar128._8_4_;
      auVar191._12_4_ = fVar60 * auVar128._12_4_;
      auVar205._0_4_ = auVar230._0_4_ * fVar86;
      auVar205._4_4_ = auVar230._4_4_ * fVar88;
      auVar205._8_4_ = auVar230._8_4_ * fVar166;
      auVar205._12_4_ = auVar230._12_4_ * fVar60;
      auVar93 = vfmadd231ps_fma(auVar191,auVar277,auVar275);
      auVar20 = vfmadd231ps_fma(auVar205,(undefined1  [16])0x0,auVar277);
      auVar230 = vshufps_avx(auVar93,auVar93,0xe8);
      auVar274 = vshufps_avx(auVar20,auVar20,0xe8);
      auVar227 = ZEXT1664(auVar274);
      auVar128 = vcmpps_avx(auVar230,auVar274,1);
      uVar54 = vextractps_avx(auVar128,0);
      auVar234 = auVar20;
      if ((uVar54 & 1) == 0) {
        auVar234 = auVar93;
      }
      auVar214 = vmaxss_avx(auVar234,auVar214);
      auVar253 = vminps_avx(auVar253,auVar149);
      auVar149 = vminps_avx(auVar230,auVar274);
      auVar149 = vminps_avx(auVar253,auVar149);
      auVar131 = vshufps_avx(auVar131,auVar131,0x55);
      auVar131 = vblendps_avx(auVar131,auVar128,2);
      auVar128 = vpslld_avx(auVar131,0x1f);
      auVar131 = vshufpd_avx(auVar245,auVar245,1);
      auVar131 = vinsertps_avx(auVar131,auVar20,0x9c);
      auVar253 = vshufpd_avx(auVar167,auVar167,1);
      auVar253 = vinsertps_avx(auVar253,auVar93,0x9c);
      auVar131 = vblendvps_avx(auVar253,auVar131,auVar128);
      auVar253 = vmovshdup_avx(auVar131);
      auVar131 = vmaxss_avx(auVar253,auVar131);
      fVar166 = auVar149._0_4_;
      auVar253 = vmovshdup_avx(auVar149);
      fVar88 = auVar131._0_4_;
      fVar122 = auVar253._0_4_;
      fVar86 = auVar214._0_4_;
      if (((0.0001 <= fVar166) || (fVar88 <= -0.0001)) && (0.0001 <= fVar122 || fVar88 <= -0.0001))
      goto code_r0x0118be4a;
      goto LAB_0118be71;
    }
    local_440 = vinsertps_avx(auVar8,auVar9,0x10);
    goto LAB_0118b58d;
  }
  if (bVar57) goto LAB_0118ca22;
  uVar56 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar80._4_4_ = uVar56;
  auVar80._0_4_ = uVar56;
  auVar80._8_4_ = uVar56;
  auVar80._12_4_ = uVar56;
  auVar8 = vcmpps_avx(local_450,auVar80,2);
  uVar47 = vmovmskps_avx(auVar8);
  uVar48 = (ulong)((uint)uVar58 & uVar47);
  goto LAB_0118adab;
code_r0x0118be4a:
  auVar253 = vcmpps_avx(auVar253,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar167 = vcmpps_avx(auVar149,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar253 = vandps_avx(auVar167,auVar253);
  if (fVar86 <= -0.0001 || (auVar253 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0118bb3d;
LAB_0118be71:
  auVar167 = vcmpps_avx(auVar149,_DAT_01f45a50,1);
  auVar245 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar253 = vcmpss_avx(auVar214,ZEXT816(0) << 0x20,1);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar116._8_4_ = 0xbf800000;
  auVar116._0_8_ = 0xbf800000bf800000;
  auVar116._12_4_ = 0xbf800000;
  auVar253 = vblendvps_avx(auVar98,auVar116,auVar253);
  auVar167 = vblendvps_avx(auVar98,auVar116,auVar167);
  fVar229 = auVar167._0_4_;
  fVar60 = auVar253._0_4_;
  auVar253 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar229 == fVar60) && (!NAN(fVar229) && !NAN(fVar60))) {
    auVar253 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar229 == fVar60) && (!NAN(fVar229) && !NAN(fVar60))) {
    auVar245 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar167 = vmovshdup_avx(auVar167);
  fVar262 = auVar167._0_4_;
  if ((fVar229 != fVar262) || (NAN(fVar229) || NAN(fVar262))) {
    if ((fVar122 != fVar166) || (NAN(fVar122) || NAN(fVar166))) {
      auVar129._0_8_ = auVar149._0_8_ ^ 0x8000000080000000;
      auVar129._8_4_ = auVar149._8_4_ ^ 0x80000000;
      auVar129._12_4_ = auVar149._12_4_ ^ 0x80000000;
      auVar130._0_4_ = -fVar166 / (fVar122 - fVar166);
      auVar130._4_12_ = auVar129._4_12_;
      auVar149 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar130._0_4_)),auVar130,ZEXT416(0));
      auVar167 = auVar149;
    }
    else {
      auVar149 = ZEXT816(0) << 0x20;
      if ((fVar166 != 0.0) || (auVar167 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar166))) {
        auVar149 = SUB6416(ZEXT464(0x7f800000),0);
        auVar167 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar253 = vminss_avx(auVar253,auVar149);
    auVar245 = vmaxss_avx(auVar167,auVar245);
  }
  auVar131 = vcmpss_avx(auVar131,ZEXT416(0),1);
  auVar99._8_4_ = 0x3f800000;
  auVar99._0_8_ = 0x3f8000003f800000;
  auVar99._12_4_ = 0x3f800000;
  auVar117._8_4_ = 0xbf800000;
  auVar117._0_8_ = 0xbf800000bf800000;
  auVar117._12_4_ = 0xbf800000;
  auVar131 = vblendvps_avx(auVar99,auVar117,auVar131);
  fVar122 = auVar131._0_4_;
  if ((fVar60 != fVar122) || (NAN(fVar60) || NAN(fVar122))) {
    if ((fVar88 != fVar86) || (NAN(fVar88) || NAN(fVar86))) {
      auVar73._0_8_ = auVar214._0_8_ ^ 0x8000000080000000;
      auVar73._8_4_ = auVar214._8_4_ ^ 0x80000000;
      auVar73._12_4_ = auVar214._12_4_ ^ 0x80000000;
      auVar132._0_4_ = -fVar86 / (fVar88 - fVar86);
      auVar132._4_12_ = auVar73._4_12_;
      auVar131 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar132._0_4_)),auVar132,ZEXT416(0));
      auVar149 = auVar131;
    }
    else {
      auVar131 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar86 != 0.0) || (auVar149 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar86))) {
        auVar131 = SUB6416(ZEXT464(0xff800000),0);
        auVar149 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar253 = vminss_avx(auVar253,auVar149);
    auVar245 = vmaxss_avx(auVar131,auVar245);
  }
  if ((fVar262 != fVar122) || (NAN(fVar262) || NAN(fVar122))) {
    auVar253 = vminss_avx(auVar253,SUB6416(ZEXT464(0x3f800000),0));
    auVar245 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar245);
  }
  auVar131 = vmaxss_avx(ZEXT816(0) << 0x40,auVar253);
  auVar253 = vminss_avx(auVar245,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar253._0_4_ < auVar131._0_4_) goto LAB_0118bb3d;
  auVar131 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar131._0_4_ + -0.1)));
  auVar253 = vminss_avx(ZEXT416((uint)(auVar253._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar143._0_8_ = auVar187._0_8_;
  auVar143._8_8_ = auVar143._0_8_;
  auVar219._8_8_ = local_4e0._0_8_;
  auVar219._0_8_ = local_4e0._0_8_;
  auVar235._8_8_ = auVar275._0_8_;
  auVar235._0_8_ = auVar275._0_8_;
  auVar149 = vshufpd_avx(local_4e0._0_16_,local_4e0._0_16_,3);
  auVar167 = vshufpd_avx(auVar275,auVar275,3);
  auVar245 = vshufps_avx(auVar131,auVar253,0);
  auVar74._8_4_ = 0x3f800000;
  auVar74._0_8_ = 0x3f8000003f800000;
  auVar74._12_4_ = 0x3f800000;
  auVar187 = vsubps_avx(auVar74,auVar245);
  local_620 = auVar64._0_4_;
  fStack_61c = auVar64._4_4_;
  fStack_618 = auVar64._8_4_;
  fStack_614 = auVar64._12_4_;
  fVar122 = auVar245._0_4_;
  auVar75._0_4_ = fVar122 * local_620;
  fVar86 = auVar245._4_4_;
  auVar75._4_4_ = fVar86 * fStack_61c;
  fVar88 = auVar245._8_4_;
  auVar75._8_4_ = fVar88 * fStack_618;
  fVar166 = auVar245._12_4_;
  auVar75._12_4_ = fVar166 * fStack_614;
  auVar181._0_4_ = fVar122 * auVar149._0_4_;
  auVar181._4_4_ = fVar86 * auVar149._4_4_;
  auVar181._8_4_ = fVar88 * auVar149._8_4_;
  auVar181._12_4_ = fVar166 * auVar149._12_4_;
  auVar192._0_4_ = fVar122 * auVar167._0_4_;
  auVar192._4_4_ = fVar86 * auVar167._4_4_;
  auVar192._8_4_ = fVar88 * auVar167._8_4_;
  auVar192._12_4_ = fVar166 * auVar167._12_4_;
  auVar206._0_4_ = fVar122 * auVar91._0_4_;
  auVar206._4_4_ = fVar86 * auVar91._4_4_;
  auVar206._8_4_ = fVar88 * auVar91._8_4_;
  auVar206._12_4_ = fVar166 * auVar91._12_4_;
  auVar149 = vfmadd231ps_fma(auVar75,auVar187,auVar143);
  auVar167 = vfmadd231ps_fma(auVar181,auVar187,auVar219);
  auVar245 = vfmadd231ps_fma(auVar192,auVar187,auVar235);
  auVar187 = vfmadd231ps_fma(auVar206,auVar187,ZEXT816(0));
  auVar64 = vmovshdup_avx(auVar68);
  auVar275 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar131._0_4_)),auVar68,
                             ZEXT416((uint)(1.0 - auVar131._0_4_)));
  auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar253._0_4_)),auVar68,
                            ZEXT416((uint)(1.0 - auVar253._0_4_)));
  fVar122 = 1.0 / fVar85;
  auVar131 = vsubps_avx(auVar167,auVar149);
  auVar220._0_4_ = auVar131._0_4_ * 3.0;
  auVar220._4_4_ = auVar131._4_4_ * 3.0;
  auVar220._8_4_ = auVar131._8_4_ * 3.0;
  auVar220._12_4_ = auVar131._12_4_ * 3.0;
  auVar131 = vsubps_avx(auVar245,auVar167);
  auVar236._0_4_ = auVar131._0_4_ * 3.0;
  auVar236._4_4_ = auVar131._4_4_ * 3.0;
  auVar236._8_4_ = auVar131._8_4_ * 3.0;
  auVar236._12_4_ = auVar131._12_4_ * 3.0;
  auVar131 = vsubps_avx(auVar187,auVar245);
  auVar246._0_4_ = auVar131._0_4_ * 3.0;
  auVar246._4_4_ = auVar131._4_4_ * 3.0;
  auVar246._8_4_ = auVar131._8_4_ * 3.0;
  auVar246._12_4_ = auVar131._12_4_ * 3.0;
  auVar64 = vminps_avx(auVar236,auVar246);
  auVar131 = vmaxps_avx(auVar236,auVar246);
  auVar64 = vminps_avx(auVar220,auVar64);
  auVar131 = vmaxps_avx(auVar220,auVar131);
  auVar91 = vshufpd_avx(auVar64,auVar64,3);
  auVar253 = vshufpd_avx(auVar131,auVar131,3);
  auVar64 = vminps_avx(auVar64,auVar91);
  auVar131 = vmaxps_avx(auVar131,auVar253);
  auVar237._0_4_ = auVar64._0_4_ * fVar122;
  auVar237._4_4_ = auVar64._4_4_ * fVar122;
  auVar237._8_4_ = auVar64._8_4_ * fVar122;
  auVar237._12_4_ = auVar64._12_4_ * fVar122;
  auVar221._0_4_ = auVar131._0_4_ * fVar122;
  auVar221._4_4_ = auVar131._4_4_ * fVar122;
  auVar221._8_4_ = auVar131._8_4_ * fVar122;
  auVar221._12_4_ = auVar131._12_4_ * fVar122;
  fVar122 = 1.0 / (auVar68._0_4_ - auVar275._0_4_);
  auVar131 = vshufpd_avx(auVar149,auVar149,3);
  auVar64 = vshufpd_avx(auVar167,auVar167,3);
  auVar91 = vshufpd_avx(auVar245,auVar245,3);
  auVar253 = vshufpd_avx(auVar187,auVar187,3);
  auVar131 = vsubps_avx(auVar131,auVar149);
  auVar149 = vsubps_avx(auVar64,auVar167);
  auVar167 = vsubps_avx(auVar91,auVar245);
  auVar253 = vsubps_avx(auVar253,auVar187);
  auVar64 = vminps_avx(auVar131,auVar149);
  auVar131 = vmaxps_avx(auVar131,auVar149);
  auVar91 = vminps_avx(auVar167,auVar253);
  auVar91 = vminps_avx(auVar64,auVar91);
  auVar64 = vmaxps_avx(auVar167,auVar253);
  auVar131 = vmaxps_avx(auVar131,auVar64);
  auVar268._0_4_ = fVar122 * auVar91._0_4_;
  auVar268._4_4_ = fVar122 * auVar91._4_4_;
  auVar268._8_4_ = fVar122 * auVar91._8_4_;
  auVar268._12_4_ = fVar122 * auVar91._12_4_;
  auVar254._0_4_ = fVar122 * auVar131._0_4_;
  auVar254._4_4_ = fVar122 * auVar131._4_4_;
  auVar254._8_4_ = fVar122 * auVar131._8_4_;
  auVar254._12_4_ = fVar122 * auVar131._12_4_;
  auVar253 = vinsertps_avx(auVar8,auVar275,0x10);
  auVar149 = vinsertps_avx(auVar9,auVar68,0x10);
  auVar247._0_4_ = (auVar253._0_4_ + auVar149._0_4_) * 0.5;
  auVar247._4_4_ = (auVar253._4_4_ + auVar149._4_4_) * 0.5;
  auVar247._8_4_ = (auVar253._8_4_ + auVar149._8_4_) * 0.5;
  auVar247._12_4_ = (auVar253._12_4_ + auVar149._12_4_) * 0.5;
  auVar76._4_4_ = auVar247._0_4_;
  auVar76._0_4_ = auVar247._0_4_;
  auVar76._8_4_ = auVar247._0_4_;
  auVar76._12_4_ = auVar247._0_4_;
  auVar131 = vfmadd213ps_fma(local_390,auVar76,auVar11);
  auVar64 = vfmadd213ps_fma(local_3a0,auVar76,auVar12);
  auVar91 = vfmadd213ps_fma(local_3b0,auVar76,auVar13);
  auVar9 = vsubps_avx(auVar64,auVar131);
  auVar131 = vfmadd213ps_fma(auVar9,auVar76,auVar131);
  auVar9 = vsubps_avx(auVar91,auVar64);
  auVar9 = vfmadd213ps_fma(auVar9,auVar76,auVar64);
  auVar9 = vsubps_avx(auVar9,auVar131);
  auVar131 = vfmadd231ps_fma(auVar131,auVar9,auVar76);
  auVar77._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
  auVar77._8_4_ = auVar9._8_4_ * 3.0;
  auVar77._12_4_ = auVar9._12_4_ * 3.0;
  auVar278._8_8_ = auVar131._0_8_;
  auVar278._0_8_ = auVar131._0_8_;
  auVar9 = vshufpd_avx(auVar131,auVar131,3);
  auVar131 = vshufps_avx(auVar247,auVar247,0x55);
  auVar245 = vsubps_avx(auVar9,auVar278);
  auVar214 = vfmadd231ps_fma(auVar278,auVar131,auVar245);
  auVar285._8_8_ = auVar77._0_8_;
  auVar285._0_8_ = auVar77._0_8_;
  auVar9 = vshufpd_avx(auVar77,auVar77,3);
  auVar9 = vsubps_avx(auVar9,auVar285);
  auVar187 = vfmadd213ps_fma(auVar9,auVar131,auVar285);
  auVar131 = vmovshdup_avx(auVar187);
  auVar286._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
  auVar286._8_4_ = auVar131._8_4_ ^ 0x80000000;
  auVar286._12_4_ = auVar131._12_4_ ^ 0x80000000;
  auVar64 = vmovshdup_avx(auVar245);
  auVar9 = vunpcklps_avx(auVar64,auVar286);
  auVar91 = vshufps_avx(auVar9,auVar286,4);
  auVar167 = vshufps_avx(auVar247,auVar247,0x54);
  auVar133._0_8_ = auVar245._0_8_ ^ 0x8000000080000000;
  auVar133._8_4_ = auVar245._8_4_ ^ 0x80000000;
  auVar133._12_4_ = auVar245._12_4_ ^ 0x80000000;
  auVar9 = vmovlhps_avx(auVar133,auVar187);
  auVar9 = vshufps_avx(auVar9,auVar187,8);
  auVar131 = vfmsub231ss_fma(ZEXT416((uint)(auVar245._0_4_ * auVar131._0_4_)),auVar64,auVar187);
  uVar56 = auVar131._0_4_;
  auVar78._4_4_ = uVar56;
  auVar78._0_4_ = uVar56;
  auVar78._8_4_ = uVar56;
  auVar78._12_4_ = uVar56;
  auVar131 = vdivps_avx(auVar91,auVar78);
  auVar64 = vdivps_avx(auVar9,auVar78);
  fVar88 = auVar214._0_4_;
  fVar122 = auVar131._0_4_;
  auVar9 = vshufps_avx(auVar214,auVar214,0x55);
  fVar86 = auVar64._0_4_;
  auVar79._0_4_ = fVar88 * fVar122 + auVar9._0_4_ * fVar86;
  auVar79._4_4_ = fVar88 * auVar131._4_4_ + auVar9._4_4_ * auVar64._4_4_;
  auVar79._8_4_ = fVar88 * auVar131._8_4_ + auVar9._8_4_ * auVar64._8_4_;
  auVar79._12_4_ = fVar88 * auVar131._12_4_ + auVar9._12_4_ * auVar64._12_4_;
  auVar274 = vsubps_avx(auVar167,auVar79);
  auVar167 = vmovshdup_avx(auVar131);
  auVar9 = vinsertps_avx(auVar237,auVar268,0x1c);
  auVar157._0_4_ = auVar167._0_4_ * auVar9._0_4_;
  auVar157._4_4_ = auVar167._4_4_ * auVar9._4_4_;
  auVar157._8_4_ = auVar167._8_4_ * auVar9._8_4_;
  auVar157._12_4_ = auVar167._12_4_ * auVar9._12_4_;
  auVar91 = vinsertps_avx(auVar221,auVar254,0x1c);
  auVar100._0_4_ = auVar91._0_4_ * auVar167._0_4_;
  auVar100._4_4_ = auVar91._4_4_ * auVar167._4_4_;
  auVar100._8_4_ = auVar91._8_4_ * auVar167._8_4_;
  auVar100._12_4_ = auVar91._12_4_ * auVar167._12_4_;
  auVar214 = vminps_avx(auVar157,auVar100);
  auVar187 = vmaxps_avx(auVar100,auVar157);
  auVar167 = vinsertps_avx(auVar268,auVar237,0x4c);
  auVar128 = vmovshdup_avx(auVar64);
  auVar245 = vinsertps_avx(auVar254,auVar221,0x4c);
  auVar255._0_4_ = auVar128._0_4_ * auVar167._0_4_;
  auVar255._4_4_ = auVar128._4_4_ * auVar167._4_4_;
  auVar255._8_4_ = auVar128._8_4_ * auVar167._8_4_;
  auVar255._12_4_ = auVar128._12_4_ * auVar167._12_4_;
  auVar238._0_4_ = auVar128._0_4_ * auVar245._0_4_;
  auVar238._4_4_ = auVar128._4_4_ * auVar245._4_4_;
  auVar238._8_4_ = auVar128._8_4_ * auVar245._8_4_;
  auVar238._12_4_ = auVar128._12_4_ * auVar245._12_4_;
  auVar128 = vminps_avx(auVar255,auVar238);
  auVar269._0_4_ = auVar214._0_4_ + auVar128._0_4_;
  auVar269._4_4_ = auVar214._4_4_ + auVar128._4_4_;
  auVar269._8_4_ = auVar214._8_4_ + auVar128._8_4_;
  auVar269._12_4_ = auVar214._12_4_ + auVar128._12_4_;
  auVar214 = vmaxps_avx(auVar238,auVar255);
  auVar101._0_4_ = auVar214._0_4_ + auVar187._0_4_;
  auVar101._4_4_ = auVar214._4_4_ + auVar187._4_4_;
  auVar101._8_4_ = auVar214._8_4_ + auVar187._8_4_;
  auVar101._12_4_ = auVar214._12_4_ + auVar187._12_4_;
  auVar239._8_8_ = 0x3f80000000000000;
  auVar239._0_8_ = 0x3f80000000000000;
  auVar187 = vsubps_avx(auVar239,auVar101);
  auVar214 = vsubps_avx(auVar239,auVar269);
  auVar128 = vsubps_avx(auVar253,auVar247);
  auVar230 = vsubps_avx(auVar149,auVar247);
  auVar118._0_4_ = fVar122 * auVar9._0_4_;
  auVar118._4_4_ = fVar122 * auVar9._4_4_;
  auVar118._8_4_ = fVar122 * auVar9._8_4_;
  auVar118._12_4_ = fVar122 * auVar9._12_4_;
  auVar270._0_4_ = fVar122 * auVar91._0_4_;
  auVar270._4_4_ = fVar122 * auVar91._4_4_;
  auVar270._8_4_ = fVar122 * auVar91._8_4_;
  auVar270._12_4_ = fVar122 * auVar91._12_4_;
  auVar91 = vminps_avx(auVar118,auVar270);
  auVar9 = vmaxps_avx(auVar270,auVar118);
  auVar158._0_4_ = fVar86 * auVar167._0_4_;
  auVar158._4_4_ = fVar86 * auVar167._4_4_;
  auVar158._8_4_ = fVar86 * auVar167._8_4_;
  auVar158._12_4_ = fVar86 * auVar167._12_4_;
  auVar222._0_4_ = fVar86 * auVar245._0_4_;
  auVar222._4_4_ = fVar86 * auVar245._4_4_;
  auVar222._8_4_ = fVar86 * auVar245._8_4_;
  auVar222._12_4_ = fVar86 * auVar245._12_4_;
  auVar167 = vminps_avx(auVar158,auVar222);
  auVar271._0_4_ = auVar91._0_4_ + auVar167._0_4_;
  auVar271._4_4_ = auVar91._4_4_ + auVar167._4_4_;
  auVar271._8_4_ = auVar91._8_4_ + auVar167._8_4_;
  auVar271._12_4_ = auVar91._12_4_ + auVar167._12_4_;
  fVar262 = auVar128._0_4_;
  auVar279._0_4_ = fVar262 * auVar187._0_4_;
  fVar263 = auVar128._4_4_;
  auVar279._4_4_ = fVar263 * auVar187._4_4_;
  fVar264 = auVar128._8_4_;
  auVar279._8_4_ = fVar264 * auVar187._8_4_;
  fVar197 = auVar128._12_4_;
  auVar279._12_4_ = fVar197 * auVar187._12_4_;
  auVar91 = vmaxps_avx(auVar222,auVar158);
  auVar223._0_4_ = fVar262 * auVar214._0_4_;
  auVar223._4_4_ = fVar263 * auVar214._4_4_;
  auVar223._8_4_ = fVar264 * auVar214._8_4_;
  auVar223._12_4_ = fVar197 * auVar214._12_4_;
  fVar88 = auVar230._0_4_;
  auVar102._0_4_ = fVar88 * auVar187._0_4_;
  fVar166 = auVar230._4_4_;
  auVar102._4_4_ = fVar166 * auVar187._4_4_;
  fVar60 = auVar230._8_4_;
  auVar102._8_4_ = fVar60 * auVar187._8_4_;
  fVar229 = auVar230._12_4_;
  auVar102._12_4_ = fVar229 * auVar187._12_4_;
  auVar240._0_4_ = fVar88 * auVar214._0_4_;
  auVar240._4_4_ = fVar166 * auVar214._4_4_;
  auVar240._8_4_ = fVar60 * auVar214._8_4_;
  auVar240._12_4_ = fVar229 * auVar214._12_4_;
  auVar119._0_4_ = auVar9._0_4_ + auVar91._0_4_;
  auVar119._4_4_ = auVar9._4_4_ + auVar91._4_4_;
  auVar119._8_4_ = auVar9._8_4_ + auVar91._8_4_;
  auVar119._12_4_ = auVar9._12_4_ + auVar91._12_4_;
  auVar159._8_8_ = 0x3f800000;
  auVar159._0_8_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar159,auVar119);
  auVar91 = vsubps_avx(auVar159,auVar271);
  auVar272._0_4_ = fVar262 * auVar9._0_4_;
  auVar272._4_4_ = fVar263 * auVar9._4_4_;
  auVar272._8_4_ = fVar264 * auVar9._8_4_;
  auVar272._12_4_ = fVar197 * auVar9._12_4_;
  auVar256._0_4_ = fVar262 * auVar91._0_4_;
  auVar256._4_4_ = fVar263 * auVar91._4_4_;
  auVar256._8_4_ = fVar264 * auVar91._8_4_;
  auVar256._12_4_ = fVar197 * auVar91._12_4_;
  auVar120._0_4_ = fVar88 * auVar9._0_4_;
  auVar120._4_4_ = fVar166 * auVar9._4_4_;
  auVar120._8_4_ = fVar60 * auVar9._8_4_;
  auVar120._12_4_ = fVar229 * auVar9._12_4_;
  auVar160._0_4_ = fVar88 * auVar91._0_4_;
  auVar160._4_4_ = fVar166 * auVar91._4_4_;
  auVar160._8_4_ = fVar60 * auVar91._8_4_;
  auVar160._12_4_ = fVar229 * auVar91._12_4_;
  auVar9 = vminps_avx(auVar272,auVar256);
  auVar91 = vminps_avx(auVar120,auVar160);
  auVar9 = vminps_avx(auVar9,auVar91);
  auVar91 = vmaxps_avx(auVar256,auVar272);
  auVar167 = vmaxps_avx(auVar160,auVar120);
  auVar245 = vminps_avx(auVar279,auVar223);
  auVar187 = vminps_avx(auVar102,auVar240);
  auVar245 = vminps_avx(auVar245,auVar187);
  auVar9 = vhaddps_avx(auVar9,auVar245);
  auVar91 = vmaxps_avx(auVar167,auVar91);
  auVar167 = vmaxps_avx(auVar223,auVar279);
  auVar245 = vmaxps_avx(auVar240,auVar102);
  auVar167 = vmaxps_avx(auVar245,auVar167);
  auVar91 = vhaddps_avx(auVar91,auVar167);
  auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
  auVar91 = vshufps_avx(auVar91,auVar91,0xe8);
  auVar241._0_4_ = auVar274._0_4_ + auVar9._0_4_;
  auVar241._4_4_ = auVar274._4_4_ + auVar9._4_4_;
  auVar241._8_4_ = auVar274._8_4_ + auVar9._8_4_;
  auVar241._12_4_ = auVar274._12_4_ + auVar9._12_4_;
  auVar224._0_4_ = auVar274._0_4_ + auVar91._0_4_;
  auVar224._4_4_ = auVar274._4_4_ + auVar91._4_4_;
  auVar224._8_4_ = auVar274._8_4_ + auVar91._8_4_;
  auVar224._12_4_ = auVar274._12_4_ + auVar91._12_4_;
  auVar227 = ZEXT1664(auVar224);
  auVar9 = vmaxps_avx(auVar253,auVar241);
  auVar91 = vminps_avx(auVar224,auVar149);
  auVar9 = vcmpps_avx(auVar91,auVar9,1);
  auVar9 = vshufps_avx(auVar9,auVar9,0x50);
  if ((auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar9[0xf] < '\0')
  goto LAB_0118bb3d;
  bVar51 = 0;
  if ((auVar196._0_4_ < auVar241._0_4_) && (bVar51 = 0, auVar224._0_4_ < auVar149._0_4_)) {
    auVar91 = vmovshdup_avx(auVar241);
    auVar9 = vcmpps_avx(auVar224,auVar149,1);
    bVar51 = auVar9[4] & auVar275._0_4_ < auVar91._0_4_;
  }
  if (((3 < (uint)uVar53 || fVar85 < 0.001) | bVar51) != 1) goto LAB_0118c9da;
  lVar50 = 0xc9;
  auVar227 = ZEXT464(0x40400000);
  do {
    lVar50 = lVar50 + -1;
    if (lVar50 == 0) goto LAB_0118bb3d;
    fVar166 = auVar274._0_4_;
    fVar88 = 1.0 - fVar166;
    fVar85 = fVar88 * fVar88 * fVar88;
    fVar87 = fVar166 * 3.0 * fVar88 * fVar88;
    fVar88 = fVar88 * fVar166 * fVar166 * 3.0;
    auVar144._4_4_ = fVar85;
    auVar144._0_4_ = fVar85;
    auVar144._8_4_ = fVar85;
    auVar144._12_4_ = fVar85;
    auVar121._4_4_ = fVar87;
    auVar121._0_4_ = fVar87;
    auVar121._8_4_ = fVar87;
    auVar121._12_4_ = fVar87;
    auVar103._4_4_ = fVar88;
    auVar103._0_4_ = fVar88;
    auVar103._8_4_ = fVar88;
    auVar103._12_4_ = fVar88;
    fVar166 = fVar166 * fVar166 * fVar166;
    auVar161._0_4_ = (float)local_3c0._0_4_ * fVar166;
    auVar161._4_4_ = (float)local_3c0._4_4_ * fVar166;
    auVar161._8_4_ = fStack_3b8 * fVar166;
    auVar161._12_4_ = fStack_3b4 * fVar166;
    auVar8 = vfmadd231ps_fma(auVar161,auVar13,auVar103);
    auVar8 = vfmadd231ps_fma(auVar8,auVar12,auVar121);
    auVar8 = vfmadd231ps_fma(auVar8,auVar11,auVar144);
    auVar104._8_8_ = auVar8._0_8_;
    auVar104._0_8_ = auVar8._0_8_;
    auVar8 = vshufpd_avx(auVar8,auVar8,3);
    auVar9 = vshufps_avx(auVar274,auVar274,0x55);
    auVar8 = vsubps_avx(auVar8,auVar104);
    auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar104);
    fVar85 = auVar9._0_4_;
    auVar8 = vshufps_avx(auVar9,auVar9,0x55);
    auVar105._0_4_ = fVar122 * fVar85 + fVar86 * auVar8._0_4_;
    auVar105._4_4_ = auVar131._4_4_ * fVar85 + auVar64._4_4_ * auVar8._4_4_;
    auVar105._8_4_ = auVar131._8_4_ * fVar85 + auVar64._8_4_ * auVar8._8_4_;
    auVar105._12_4_ = auVar131._12_4_ * fVar85 + auVar64._12_4_ * auVar8._12_4_;
    auVar274 = vsubps_avx(auVar274,auVar105);
    auVar8 = vandps_avx(auVar243,auVar9);
    auVar9 = vshufps_avx(auVar8,auVar8,0xf5);
    auVar8 = vmaxss_avx(auVar9,auVar8);
  } while ((float)local_3d0._0_4_ <= auVar8._0_4_);
  local_120 = auVar274._0_4_;
  if ((local_120 < 0.0) || (1.0 < local_120)) goto LAB_0118bb3d;
  auVar8 = vmovshdup_avx(auVar274);
  fVar85 = auVar8._0_4_;
  if ((fVar85 < 0.0) || (1.0 < fVar85)) goto LAB_0118bb3d;
  auVar9 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                         ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar245 = vinsertps_avx(auVar9,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar9 = vdpps_avx(auVar245,auVar62,0x7f);
  auVar131 = vdpps_avx(auVar245,auVar112,0x7f);
  auVar64 = vdpps_avx(auVar245,local_3e0,0x7f);
  auVar91 = vdpps_avx(auVar245,local_3f0,0x7f);
  auVar253 = vdpps_avx(auVar245,local_400,0x7f);
  auVar149 = vdpps_avx(auVar245,local_410,0x7f);
  auVar167 = vdpps_avx(auVar245,local_420,0x7f);
  auVar245 = vdpps_avx(auVar245,local_430,0x7f);
  fVar87 = 1.0 - fVar85;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar85 * auVar253._0_4_)),ZEXT416((uint)fVar87),auVar9);
  auVar131 = vfmadd231ss_fma(ZEXT416((uint)(auVar149._0_4_ * fVar85)),ZEXT416((uint)fVar87),auVar131
                            );
  auVar227 = ZEXT1664(auVar131);
  auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar167._0_4_ * fVar85)),ZEXT416((uint)fVar87),auVar64);
  auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar85 * auVar245._0_4_)),ZEXT416((uint)fVar87),auVar91);
  fVar86 = 1.0 - local_120;
  fVar85 = fVar86 * local_120 * local_120 * 3.0;
  fVar166 = local_120 * local_120 * local_120;
  auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * auVar91._0_4_)),ZEXT416((uint)fVar85),auVar64);
  fVar87 = local_120 * 3.0 * fVar86 * fVar86;
  auVar131 = vfmadd231ss_fma(auVar64,ZEXT416((uint)fVar87),auVar131);
  fVar122 = fVar86 * fVar86 * fVar86;
  auVar9 = vfmadd231ss_fma(auVar131,ZEXT416((uint)fVar122),auVar9);
  fVar88 = auVar9._0_4_;
  if ((fVar88 < fVar59) || (fVar60 = *(float *)(ray + k * 4 + 0x100), fVar60 < fVar88))
  goto LAB_0118bb3d;
  pGVar4 = (context->scene->geometries).items[uVar47].ptr;
  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar51 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0118c970;
    auVar9 = vshufps_avx(auVar274,auVar274,0x55);
    auVar225._8_4_ = 0x3f800000;
    auVar225._0_8_ = 0x3f8000003f800000;
    auVar225._12_4_ = 0x3f800000;
    auVar131 = vsubps_avx(auVar225,auVar9);
    fVar229 = auVar9._0_4_;
    auVar242._0_4_ = fVar229 * auVar232._0_4_;
    fVar262 = auVar9._4_4_;
    auVar242._4_4_ = fVar262 * auVar232._4_4_;
    fVar263 = auVar9._8_4_;
    auVar242._8_4_ = fVar263 * auVar232._8_4_;
    fVar264 = auVar9._12_4_;
    auVar242._12_4_ = fVar264 * auVar232._12_4_;
    auVar248._0_4_ = fVar229 * auVar66._0_4_;
    auVar248._4_4_ = fVar262 * auVar66._4_4_;
    auVar248._8_4_ = fVar263 * auVar66._8_4_;
    auVar248._12_4_ = fVar264 * auVar66._12_4_;
    local_5c0 = auVar123._0_4_;
    fStack_5bc = auVar123._4_4_;
    fStack_5b8 = auVar123._8_4_;
    fStack_5b4 = auVar123._12_4_;
    auVar257._0_4_ = fVar229 * local_5c0;
    auVar257._4_4_ = fVar262 * fStack_5bc;
    auVar257._8_4_ = fVar263 * fStack_5b8;
    auVar257._12_4_ = fVar264 * fStack_5b4;
    auVar207._0_4_ = fVar229 * fVar165;
    auVar207._4_4_ = fVar262 * fVar184;
    auVar207._8_4_ = fVar263 * fVar185;
    auVar207._12_4_ = fVar264 * fVar186;
    auVar9 = vfmadd231ps_fma(auVar242,auVar131,auVar63);
    auVar64 = vfmadd231ps_fma(auVar248,auVar131,auVar126);
    auVar91 = vfmadd231ps_fma(auVar257,auVar131,auVar92);
    auVar253 = vfmadd231ps_fma(auVar207,auVar131,auVar111);
    auVar131 = vsubps_avx(auVar64,auVar9);
    auVar227 = ZEXT1664(auVar131);
    auVar9 = vsubps_avx(auVar91,auVar64);
    auVar64 = vsubps_avx(auVar253,auVar91);
    auVar258._0_4_ = local_120 * auVar9._0_4_;
    auVar258._4_4_ = local_120 * auVar9._4_4_;
    auVar258._8_4_ = local_120 * auVar9._8_4_;
    auVar258._12_4_ = local_120 * auVar9._12_4_;
    auVar193._4_4_ = fVar86;
    auVar193._0_4_ = fVar86;
    auVar193._8_4_ = fVar86;
    auVar193._12_4_ = fVar86;
    auVar91 = vfmadd231ps_fma(auVar258,auVar193,auVar131);
    auVar208._0_4_ = local_120 * auVar64._0_4_;
    auVar208._4_4_ = local_120 * auVar64._4_4_;
    auVar208._8_4_ = local_120 * auVar64._8_4_;
    auVar208._12_4_ = local_120 * auVar64._12_4_;
    auVar9 = vfmadd231ps_fma(auVar208,auVar193,auVar9);
    auVar209._0_4_ = local_120 * auVar9._0_4_;
    auVar209._4_4_ = local_120 * auVar9._4_4_;
    auVar209._8_4_ = local_120 * auVar9._8_4_;
    auVar209._12_4_ = local_120 * auVar9._12_4_;
    auVar64 = vfmadd231ps_fma(auVar209,auVar193,auVar91);
    auVar182._0_4_ = fVar166 * (float)local_490._0_4_;
    auVar182._4_4_ = fVar166 * (float)local_490._4_4_;
    auVar182._8_4_ = fVar166 * fStack_488;
    auVar182._12_4_ = fVar166 * fStack_484;
    auVar134._4_4_ = fVar85;
    auVar134._0_4_ = fVar85;
    auVar134._8_4_ = fVar85;
    auVar134._12_4_ = fVar85;
    auVar9 = vfmadd132ps_fma(auVar134,auVar182,local_480);
    auVar162._4_4_ = fVar87;
    auVar162._0_4_ = fVar87;
    auVar162._8_4_ = fVar87;
    auVar162._12_4_ = fVar87;
    auVar9 = vfmadd132ps_fma(auVar162,auVar9,local_470);
    auVar135._0_4_ = auVar64._0_4_ * 3.0;
    auVar135._4_4_ = auVar64._4_4_ * 3.0;
    auVar135._8_4_ = auVar64._8_4_ * 3.0;
    auVar135._12_4_ = auVar64._12_4_ * 3.0;
    auVar145._4_4_ = fVar122;
    auVar145._0_4_ = fVar122;
    auVar145._8_4_ = fVar122;
    auVar145._12_4_ = fVar122;
    auVar64 = vfmadd132ps_fma(auVar145,auVar9,local_460);
    auVar9 = vshufps_avx(auVar135,auVar135,0xc9);
    auVar163._0_4_ = auVar64._0_4_ * auVar9._0_4_;
    auVar163._4_4_ = auVar64._4_4_ * auVar9._4_4_;
    auVar163._8_4_ = auVar64._8_4_ * auVar9._8_4_;
    auVar163._12_4_ = auVar64._12_4_ * auVar9._12_4_;
    auVar9 = vshufps_avx(auVar64,auVar64,0xc9);
    auVar64 = vfmsub231ps_fma(auVar163,auVar135,auVar9);
    auVar9 = vmovshdup_avx(auVar64);
    local_180 = auVar9._0_8_;
    uStack_178 = local_180;
    uStack_170 = local_180;
    uStack_168 = local_180;
    auVar9 = vshufps_avx(auVar64,auVar64,0xaa);
    local_160 = auVar9._0_8_;
    uStack_158 = local_160;
    uStack_150 = local_160;
    uStack_148 = local_160;
    local_140 = auVar64._0_4_;
    uStack_13c = local_140;
    uStack_138 = local_140;
    uStack_134 = local_140;
    uStack_130 = local_140;
    uStack_12c = local_140;
    uStack_128 = local_140;
    uStack_124 = local_140;
    fStack_11c = local_120;
    fStack_118 = local_120;
    fStack_114 = local_120;
    fStack_110 = local_120;
    fStack_10c = local_120;
    fStack_108 = local_120;
    fStack_104 = local_120;
    local_100 = auVar8._0_8_;
    uStack_f8 = local_100;
    uStack_f0 = local_100;
    uStack_e8 = local_100;
    local_e0 = CONCAT44(uStack_33c,local_340);
    uStack_d8 = CONCAT44(uStack_334,uStack_338);
    uStack_d0 = CONCAT44(uStack_32c,uStack_330);
    uStack_c8 = CONCAT44(uStack_324,uStack_328);
    local_c0._4_4_ = uStack_31c;
    local_c0._0_4_ = local_320;
    local_c0._8_4_ = uStack_318;
    local_c0._12_4_ = uStack_314;
    local_c0._16_4_ = uStack_310;
    local_c0._20_4_ = uStack_30c;
    local_c0._24_4_ = uStack_308;
    local_c0._28_4_ = uStack_304;
    vpcmpeqd_avx2(local_c0,local_c0);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar88;
    local_4c0 = local_360;
    local_510.valid = (int *)local_4c0;
    local_510.geometryUserPtr = pGVar4->userPtr;
    local_510.context = context->user;
    local_510.ray = (RTCRayN *)ray;
    local_510.hit = (RTCHitN *)&local_180;
    local_510.N = 8;
    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      auVar227 = ZEXT1664(auVar131);
      (*pGVar4->occlusionFilterN)(&local_510);
    }
    auVar81 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
    auVar81 = _DAT_01f7b020 & ~auVar81;
    if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar81 >> 0x7f,0) != '\0') ||
          (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar81 >> 0xbf,0) != '\0') ||
        (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar81[0x1f] < '\0')
    {
      p_Var5 = context->args->filter;
      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
        auVar227 = ZEXT1664(auVar227._0_16_);
        (*p_Var5)(&local_510);
      }
      auVar15 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
      auVar110._8_4_ = 0xff800000;
      auVar110._0_8_ = 0xff800000ff800000;
      auVar110._12_4_ = 0xff800000;
      auVar110._16_4_ = 0xff800000;
      auVar110._20_4_ = 0xff800000;
      auVar110._24_4_ = 0xff800000;
      auVar110._28_4_ = 0xff800000;
      auVar81 = vblendvps_avx(auVar110,*(undefined1 (*) [32])(local_510.ray + 0x100),auVar15);
      *(undefined1 (*) [32])(local_510.ray + 0x100) = auVar81;
      auVar81 = _DAT_01f7b020 & ~auVar15;
      if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar81 >> 0x7f,0) != '\0') ||
            (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar81 >> 0xbf,0) != '\0') ||
          (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar81[0x1f] < '\0') {
        bVar51 = 1;
        goto LAB_0118c970;
      }
    }
    *(float *)(ray + k * 4 + 0x100) = fVar60;
  }
  bVar51 = 0;
LAB_0118c970:
  bVar57 = (bool)(bVar57 | bVar51);
  goto LAB_0118bb3d;
LAB_0118c9da:
  local_440 = vinsertps_avx(auVar8,ZEXT416((uint)fVar87),0x10);
  auVar68 = vinsertps_avx(auVar275,ZEXT416((uint)auVar68._0_4_),0x10);
  goto LAB_0118b58d;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }